

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O1

Matrix4d *
opengv::relative_pose::modules::ge::composeGwithJacobians
          (Matrix4d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,Matrix<double,_3,_9,_0,_3,_9> *x1P,
          Matrix<double,_3,_9,_0,_3,_9> *y1P,Matrix<double,_3,_9,_0,_3,_9> *z1P,
          Matrix<double,_3,_9,_0,_3,_9> *x2P,Matrix<double,_3,_9,_0,_3,_9> *y2P,
          Matrix<double,_3,_9,_0,_3,_9> *z2P,Matrix<double,_9,_9,_0,_9,_9> *m11P,
          Matrix<double,_9,_9,_0,_9,_9> *m12P,Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,
          Matrix4d *G_jac1,Matrix4d *G_jac2,Matrix4d *G_jac3)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  Matrix4d *pMVar97;
  ActualDstType actualDst;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  double dVar107;
  undefined1 auVar108 [16];
  double dVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  Matrix<double,_1,_9,_1,_1,_9> Rows;
  Matrix<double,_9,_1,_0,_9,_1> Cols;
  rotation_t R_jac3;
  rotation_t R_jac2;
  rotation_t R_jac1;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac3;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac2;
  Matrix<double,_9,_1,_0,_9,_1> Cols_jac1;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac3;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac2;
  Matrix<double,_1,_9,_1,_1,_9> Rows_jac1;
  plainobjectbase_evaluator_data<double,_0> local_580;
  Scalar local_578;
  plainobjectbase_evaluator_data<double,_0> local_570;
  double local_568;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_560;
  Matrix4d *local_540;
  Matrix<double,_3,_3,_0,_3,_3> local_538;
  Matrix<double,_9,_1,_0,_9,_1> local_4e8;
  Matrix<double,_9,_1,_0,_9,_1> local_498;
  Matrix<double,_3,_3,_0,_3,_3> local_448;
  Matrix<double,_3,_3,_0,_3,_3> local_3f8;
  Matrix<double,_3,_3,_0,_3,_3> local_3a8;
  Matrix3d *local_360;
  undefined1 local_358 [16];
  scalar_constant_op<double> local_348;
  undefined1 local_340 [16];
  Matrix<double,_3,_9,_0,_3,_9> *local_330;
  Matrix<double,_3,_9,_0,_3,_9> *local_328;
  double *local_320;
  Matrix<double,_3,_9,_0,_3,_9> *local_310;
  undefined8 local_308;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double dStack_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double dStack_238;
  double dStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  Matrix<double,_9,_1,_0,_9,_1> local_208;
  Matrix<double,_9,_1,_0,_9,_1> local_1b8;
  Matrix<double,_9,_1,_0,_9,_1> local_168;
  DstXprType *local_118;
  undefined1 local_110 [16];
  undefined1 auStack_100 [16];
  undefined1 auStack_f0 [16];
  undefined1 auStack_e0 [16];
  double local_d0;
  Matrix<double,_9,_1,_0,_9,_1> *local_c8;
  
  local_540 = __return_storage_ptr__;
  math::cayley2rot_reduced(cayley);
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [2];
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
       [0];
  dVar107 = (cayley->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array[1];
  auVar267._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] + local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4];
  auVar267._8_8_ = dVar107 + dVar107;
  auVar98 = vshufpd_avx(auVar267,auVar267,1);
  auVar108 = ZEXT816(0xc000000000000000);
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * -2.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       -2.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       2.0;
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       2.0;
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       -2.0;
  auVar539._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * 2.0;
  auVar539._8_8_ = dVar107 * -2.0;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       (double)vmovlpd_avx(auVar539);
  auVar51 = vshufpd_avx(auVar539,auVar267,1);
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       auVar51._0_8_;
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       auVar51._8_8_;
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       (double)vmovlpd_avx(auVar539);
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * -2.0;
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       -2.0;
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       2.0;
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       (double)vmovlpd_avx(auVar267);
  auVar99 = vshufpd_avx(auVar267,auVar539,1);
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       auVar98._0_8_;
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       auVar98._8_8_;
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       auVar99._0_8_;
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       auVar99._8_8_;
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar134._8_8_ = 0;
  auVar134._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  dVar107 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar560._8_8_ = 0;
  auVar560._0_8_ = dVar107;
  dVar109 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  auVar554._8_8_ = 0;
  auVar554._0_8_ = dVar109;
  auVar268._8_8_ = 0;
  auVar268._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  dVar2 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar555._8_8_ = 0;
  auVar555._0_8_ = dVar2;
  dVar3 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  auVar568._8_8_ = 0;
  auVar568._0_8_ = dVar3;
  auVar579._8_8_ = 0;
  auVar579._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmulsd_avx512f(auVar134,auVar579);
  auVar583._8_8_ = 0;
  auVar583._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar99 = vmulsd_avx512f(auVar268,auVar583);
  auVar585._8_8_ = 0;
  auVar585._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar100 = vmulsd_avx512f(auVar110,auVar585);
  auVar587._8_8_ = 0;
  auVar587._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar101 = vmulsd_avx512f(auVar134,auVar587);
  auVar590._8_8_ = 0;
  auVar590._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar102 = vmulsd_avx512f(auVar268,auVar590);
  auVar483._8_8_ = 0;
  auVar483._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] * (dVar107 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[2] +
             dVar109 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[5] +
             dVar2 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[8]);
  auVar530._8_8_ = 0;
  auVar530._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (dVar3 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2] + auVar99._0_8_ + auVar98._0_8_) +
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * (auVar101._0_8_ + auVar102._0_8_ + auVar100._0_8_);
  auVar100 = vaddsd_avx512f(auVar483,auVar530);
  vmovsd_avx512f(auVar100);
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0] = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[0];
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] * -2.0;
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] * -2.0;
  dVar3 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[8] * -2.0;
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = dVar3;
  auVar98 = vmulsd_avx512f(auVar550,auVar98);
  auVar531._8_8_ = 0;
  auVar531._0_8_ =
       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4];
  auVar98 = vaddsd_avx512f(auVar531,auVar98);
  auVar484._8_8_ = 0;
  auVar484._0_8_ =
       dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar98 = vaddsd_avx512f(auVar484,auVar98);
  vmovsd_avx512f(auVar98);
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar99 = vmulsd_avx512f(auVar550,auVar99);
  auVar532._8_8_ = 0;
  auVar532._0_8_ =
       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7];
  auVar99 = vaddsd_avx512f(auVar532,auVar99);
  auVar485._8_8_ = 0;
  auVar485._0_8_ =
       dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6];
  auVar99 = vaddsd_avx512f(auVar485,auVar99);
  vmovsd_avx512f(auVar99);
  auVar486._8_8_ = 0;
  auVar486._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar533._8_8_ = 0;
  auVar533._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar535._8_8_ = 0;
  auVar535._0_8_ =
       dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
       dVar3 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2];
  auVar101 = vmulsd_avx512f(auVar535,auVar486);
  auVar98 = vmulsd_avx512f(auVar98,auVar533);
  auVar536._8_8_ = 0;
  auVar536._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar99 = vmulsd_avx512f(auVar99,auVar536);
  auVar98 = vaddsd_avx512f(auVar98,auVar99);
  auVar98 = vaddsd_avx512f(auVar101,auVar98);
  auVar98 = vaddsd_avx512f(auVar100,auVar98);
  vmovsd_avx512f(auVar98);
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0] = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[0];
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar99 = vmulsd_avx512f(auVar486,auVar100);
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar100 = vmulsd_avx512f(auVar533,auVar101);
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar101 = vmulsd_avx512f(auVar536,auVar102);
  auVar100 = vaddsd_avx512f(auVar100,auVar101);
  auVar99 = vaddsd_avx512f(auVar99,auVar100);
  vmovsd_avx512f(auVar99);
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar100 = vmulsd_avx512f(auVar486,auVar103);
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar101 = vmulsd_avx512f(auVar533,auVar104);
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar102 = vmulsd_avx512f(auVar536,auVar105);
  auVar101 = vaddsd_avx512f(auVar101,auVar102);
  auVar100 = vaddsd_avx512f(auVar100,auVar101);
  vmovsd_avx512f(auVar100);
  auVar106._8_8_ = 0;
  auVar106._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar101 = vmulsd_avx512f(auVar486,auVar106);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7];
  auVar102 = vmulsd_avx512f(auVar533,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar103 = vmulsd_avx512f(auVar536,auVar5);
  auVar102 = vaddsd_avx512f(auVar102,auVar103);
  auVar101 = vaddsd_avx512f(auVar101,auVar102);
  auVar99 = vmulsd_avx512f(auVar486,auVar99);
  auVar100 = vmulsd_avx512f(auVar533,auVar100);
  auVar101 = vmulsd_avx512f(auVar536,auVar101);
  auVar100 = vaddsd_avx512f(auVar100,auVar101);
  auVar99 = vaddsd_avx512f(auVar99,auVar100);
  auVar98 = vaddsd_avx512f(auVar98,auVar99);
  vmovsd_avx512f(auVar98);
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0] = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[0];
  auVar98 = vaddsd_avx512f(auVar539,auVar539);
  auVar99 = vmulsd_avx512f(auVar98,auVar560);
  auVar100 = vaddsd_avx512f(ZEXT816(0x4000000000000000),ZEXT816(0x4000000000000000));
  auVar101 = vmulsd_avx512f(auVar554,auVar100);
  auVar591._8_8_ = 0;
  auVar591._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar102 = vaddsd_avx512f(auVar591,auVar591);
  auVar103 = vmulsd_avx512f(auVar555,auVar102);
  auVar104 = vmulsd_avx512f(auVar98,auVar568);
  auVar105 = vmulsd_avx512f(auVar579,auVar100);
  auVar106 = vmulsd_avx512f(auVar583,auVar102);
  auVar98 = vmulsd_avx512f(auVar98,auVar585);
  auVar100 = vmulsd_avx512f(auVar587,auVar100);
  auVar102 = vmulsd_avx512f(auVar590,auVar102);
  auVar100 = vaddsd_avx512f(auVar100,auVar102);
  dVar107 = (auVar99._0_8_ + auVar101._0_8_ + auVar103._0_8_) *
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] +
            (auVar104._0_8_ + auVar105._0_8_ + auVar106._0_8_) *
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            (auVar98._0_8_ + auVar100._0_8_) *
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  dVar48 = auVar539._0_8_ * -2.0;
  auVar98 = vmulsd_avx512f(ZEXT816(0x4000000000000000),auVar108);
  auVar592._8_8_ = 0;
  auVar592._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar99 = vmulsd_avx512f(auVar592,auVar108);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2];
  auVar100 = vmulsd_avx512f(auVar99,auVar6);
  auVar569._8_8_ = 0;
  auVar569._0_8_ =
       auVar98._0_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar100 = vaddsd_avx512f(auVar569,auVar100);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar101 = vmulsd_avx512f(auVar98,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar102 = vmulsd_avx512f(auVar99,auVar8);
  auVar101 = vaddsd_avx512f(auVar101,auVar102);
  auVar570._8_8_ = 0;
  auVar570._0_8_ =
       dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3];
  auVar101 = vaddsd_avx512f(auVar570,auVar101);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar99 = vmulsd_avx512f(auVar99,auVar9);
  auVar561._8_8_ = 0;
  auVar561._0_8_ =
       auVar98._0_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar98 = vaddsd_avx512f(auVar561,auVar99);
  dVar107 = dVar107 + (dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0] + auVar100._0_8_) *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] +
                      auVar101._0_8_ *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[4] +
                      (dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] + auVar98._0_8_) *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  dVar107 = dVar107 + (dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[1] +
                      dVar3 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[2]) *
                      local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[5] +
                      (dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[3] +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[4] +
                      dVar3 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5]) *
                      local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[4] +
                      (dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7] +
                      dVar3 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[8]) * -2.0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  dVar109 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107 + ((auVar267._8_8_ + auVar267._8_8_) *
                  (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[3] +
                 dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[4] +
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5] * -4.0) *
                 local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] +
                 ((auVar267._8_8_ + auVar267._8_8_) *
                  (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
                 dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[7] +
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8] * -4.0) *
                 local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] +
                 local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] *
                 (dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[1] +
                  (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2] * -4.0 +
                 (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[5] +
                 local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5]) *
                 (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]);
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
  dVar109 = auVar539._8_8_ + auVar539._8_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = dVar109;
  auVar98 = vmulsd_avx512f(auVar556,auVar10);
  auVar571._8_8_ = 0;
  auVar571._0_8_ =
       dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4];
  auVar98 = vaddsd_avx512f(auVar571,auVar98);
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] *
            (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1] +
             dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[2] +
            (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0] * -4.0) +
            ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] * -4.0 + auVar98._0_8_) *
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            ((yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] * -4.0 +
            dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
            dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) *
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  dVar109 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] * -2.0;
  dVar2 = auVar539._8_8_ * -2.0;
  dVar107 = dVar107 + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] *
                      (dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[1] +
                       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[2] +
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0] * 4.0) +
                      ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] * 4.0 +
                      dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5]) *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[4] +
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7] *
                      ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] * 4.0 +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[8] +
                      dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar135._8_8_ = 0;
  auVar135._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  dVar48 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] * -2.0;
  dVar49 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] * -2.0;
  auVar269._8_8_ = 0;
  auVar269._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  dVar50 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] * -2.0;
  dVar107 = dVar107 + local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] *
                      (dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0] +
                      dVar50 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[2] +
                      dVar49 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1]) +
                      (dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[6] +
                      dVar49 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[7] +
                      dVar50 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8]) * auVar539._0_8_ +
                      auVar267._8_8_ *
                      (dVar49 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[4] +
                       dVar50 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5] +
                      dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[3]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  dVar109 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
  dVar2 = auVar267._8_8_ + auVar267._8_8_;
  dVar3 = auVar539._0_8_ + auVar539._0_8_;
  auVar397._8_8_ = 0;
  auVar397._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar487._8_8_ = 0;
  auVar487._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar534._8_8_ = 0;
  auVar534._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107 + (dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[1] +
                  dVar3 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[2] +
                 dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[0]) *
                 local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1] +
                 (dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[4] +
                  dVar3 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[5] +
                 dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[3]) *
                 local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] +
                 (dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                            m_storage.m_data.array[6] +
                 dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] +
                 dVar3 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8]) *
                 local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
  auVar580._8_8_ = 0;
  auVar580._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vaddsd_avx512f(auVar580,auVar580);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar99 = vmulsd_avx512f(auVar98,auVar11);
  auVar572._8_8_ = 0;
  auVar572._0_8_ =
       dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1];
  auVar99 = vaddsd_avx512f(auVar572,auVar99);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = dVar109;
  auVar100 = vmulsd_avx512f(auVar562,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar101 = vmulsd_avx512f(auVar98,auVar13);
  auVar100 = vaddsd_avx512f(auVar100,auVar101);
  auVar573._8_8_ = 0;
  auVar573._0_8_ =
       dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar100 = vaddsd_avx512f(auVar573,auVar100);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar98 = vmulsd_avx512f(auVar98,auVar14);
  auVar563._8_8_ = 0;
  auVar563._0_8_ =
       dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7];
  auVar98 = vaddsd_avx512f(auVar563,auVar98);
  dVar107 = (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] + auVar99._0_8_) *
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] +
            auVar100._0_8_ *
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] + auVar98._0_8_) *
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] * -2.0;
  dVar2 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] * -2.0;
  auVar581._8_8_ = 0;
  auVar581._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vmulsd_avx512f(auVar581,auVar108);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar99 = vmulsd_avx512f(auVar98,auVar15);
  auVar564._8_8_ = 0;
  auVar564._0_8_ =
       dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1];
  auVar99 = vaddsd_avx512f(auVar564,auVar99);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = dVar2;
  auVar100 = vmulsd_avx512f(auVar551,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar101 = vmulsd_avx512f(auVar98,auVar17);
  auVar100 = vaddsd_avx512f(auVar100,auVar101);
  auVar565._8_8_ = 0;
  auVar565._0_8_ =
       dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar100 = vaddsd_avx512f(auVar565,auVar100);
  dVar107 = dVar107 + (dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] + auVar99._0_8_) *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] +
                      auVar100._0_8_ *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[4] +
                      (dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7] +
                      auVar98._0_8_ *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  dVar107 = dVar107 + (dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[0] +
                      dVar49 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[1] +
                      dVar50 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[2]) * 2.0 +
                      (dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[3] +
                      dVar49 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[4] +
                      dVar50 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[5]) *
                      local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0] +
                      local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7] *
                      (dVar49 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[7] +
                       dVar50 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[8] +
                      dVar48 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[6]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       dVar107;
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[7] +
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0] =
       ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * 4.0 +
       dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
       dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] * 4.0 +
             dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
             dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             ((zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] * 4.0 +
             dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] +
             dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] + dVar107;
  dVar107 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[0];
  auVar546._8_8_ = 0;
  auVar546._0_8_ = dVar107;
  dVar109 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array[1];
  auVar552._8_8_ = 0;
  auVar552._0_8_ = dVar109;
  dVar2 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar3 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  auVar557._8_8_ = 0;
  auVar557._0_8_ = dVar3;
  dVar48 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4];
  auVar566._8_8_ = 0;
  auVar566._0_8_ = dVar48;
  dVar49 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[5];
  auVar574._8_8_ = 0;
  auVar574._0_8_ = dVar49;
  auVar98 = vmulsd_avx512f(auVar269,auVar574);
  auVar540._8_8_ = 0;
  auVar540._0_8_ =
       dVar48 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[5];
  auVar98 = vaddsd_avx512f(auVar540,auVar98);
  auVar537._8_8_ = 0;
  auVar537._0_8_ =
       dVar3 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2];
  auVar98 = vaddsd_avx512f(auVar537,auVar98);
  vmovsd_avx512f(auVar98);
  auVar582._8_8_ = 0;
  auVar582._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar99 = vmulsd_avx512f(auVar111,auVar582);
  auVar584._8_8_ = 0;
  auVar584._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar100 = vmulsd_avx512f(auVar135,auVar584);
  auVar586._8_8_ = 0;
  auVar586._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar101 = vmulsd_avx512f(auVar269,auVar586);
  auVar100 = vaddsd_avx512f(auVar100,auVar101);
  auVar99 = vaddsd_avx512f(auVar99,auVar100);
  vmovsd_avx512f(auVar99);
  auVar538._8_8_ = 0;
  auVar538._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar541._8_8_ = 0;
  auVar541._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar543._8_8_ = 0;
  auVar543._0_8_ =
       dVar109 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] +
       dVar2 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] +
       dVar107 * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2];
  auVar100 = vmulsd_avx512f(auVar543,auVar538);
  auVar98 = vmulsd_avx512f(auVar98,auVar541);
  auVar544._8_8_ = 0;
  auVar544._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar99 = vmulsd_avx512f(auVar99,auVar544);
  auVar98 = vaddsd_avx512f(auVar98,auVar99);
  auVar98 = vaddsd_avx512f(auVar100,auVar98);
  pdVar1 = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
           m_data.array + 4;
  vmovsd_avx512f(auVar98);
  *pdVar1 = *pdVar1;
  auVar99 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar100 = vxorpd_avx512vl(auVar269,auVar99);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar101 = vmulsd_avx512f(auVar100,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar102 = vmulsd_avx512f(auVar135,auVar19);
  auVar101 = vsubsd_avx512f(auVar101,auVar102);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar102 = vmulsd_avx512f(auVar111,auVar20);
  auVar101 = vsubsd_avx512f(auVar101,auVar102);
  vmovsd_avx512f(auVar101);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar102 = vmulsd_avx512f(auVar100,auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar103 = vmulsd_avx512f(auVar135,auVar22);
  auVar102 = vsubsd_avx512f(auVar102,auVar103);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar103 = vmulsd_avx512f(auVar111,auVar23);
  auVar102 = vsubsd_avx512f(auVar102,auVar103);
  vmovsd_avx512f(auVar102);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar100 = vmulsd_avx512f(auVar100,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar103 = vmulsd_avx512f(auVar135,auVar25);
  auVar100 = vsubsd_avx512f(auVar100,auVar103);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar103 = vmulsd_avx512f(auVar111,auVar26);
  auVar100 = vsubsd_avx512f(auVar100,auVar103);
  auVar101 = vmulsd_avx512f(auVar111,auVar101);
  auVar102 = vmulsd_avx512f(auVar135,auVar102);
  auVar100 = vmulsd_avx512f(auVar269,auVar100);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = auVar101._0_8_ + auVar102._0_8_ + auVar100._0_8_;
  auVar98 = vaddsd_avx512f(auVar98,auVar112);
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [4] = auVar98._0_8_;
  auVar100 = vxorpd_avx512vl(auVar534,auVar99);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar101 = vmulsd_avx512f(auVar487,auVar27);
  auVar270._8_8_ = 0;
  auVar270._0_8_ =
       auVar100._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar101 = vsubsd_avx512f(auVar270,auVar101);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar102 = vmulsd_avx512f(auVar397,auVar28);
  auVar101 = vsubsd_avx512f(auVar101,auVar102);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar102 = vmulsd_avx512f(auVar100,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar103 = vmulsd_avx512f(auVar487,auVar30);
  auVar102 = vsubsd_avx512f(auVar102,auVar103);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar103 = vmulsd_avx512f(auVar397,auVar31);
  auVar102 = vsubsd_avx512f(auVar102,auVar103);
  vmovsd_avx512f(auVar102);
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar103 = vmulsd_avx512f(auVar487,auVar32);
  auVar136._8_8_ = 0;
  auVar136._0_8_ =
       auVar100._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar100 = vsubsd_avx512f(auVar136,auVar103);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar103 = vmulsd_avx512f(auVar397,auVar33);
  auVar100 = vsubsd_avx512f(auVar100,auVar103);
  auVar102 = vmulsd_avx512f(auVar541,auVar102);
  auVar137._8_8_ = 0;
  auVar137._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar100._0_8_;
  auVar100 = vaddsd_avx512f(auVar102,auVar137);
  auVar138._8_8_ = 0;
  auVar138._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * auVar101._0_8_ + auVar100._0_8_;
  auVar98 = vaddsd_avx512f(auVar98,auVar138);
  pdVar1 = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
           m_data.array + 4;
  vmovsd_avx512f(auVar98);
  *pdVar1 = *pdVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar100 = vmulsd_avx512f(auVar534,auVar34);
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4];
  auVar100 = vaddsd_avx512f(auVar139,auVar100);
  auVar113._8_8_ = 0;
  auVar113._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3];
  auVar100 = vaddsd_avx512f(auVar113,auVar100);
  vmovsd_avx512f(auVar100);
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar100 = vmulsd_avx512f(auVar100,auVar140);
  auVar398._8_8_ = 0;
  auVar398._0_8_ =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + auVar100._0_8_ +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8];
  auVar98 = vaddsd_avx512f(auVar98,auVar398);
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [4] = auVar98._0_8_;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = auVar539._0_8_;
  auVar98 = vmulsd_avx512f(auVar546,auVar588);
  auVar100 = vmulsd_avx512f(auVar552,ZEXT816(0x4000000000000000));
  auVar547._8_8_ = 0;
  auVar547._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar101 = vmulsd_avx512f(auVar557,auVar588);
  auVar102 = vmulsd_avx512f(auVar566,ZEXT816(0x4000000000000000));
  auVar589._8_8_ = 0;
  auVar589._0_8_ = auVar539._0_8_;
  auVar103 = vmulsd_avx512f(auVar582,auVar589);
  auVar104 = vmulsd_avx512f(auVar584,ZEXT816(0x4000000000000000));
  auVar105 = vmulsd_avx512f(auVar586,auVar547);
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] *
            (auVar98._0_8_ +
            auVar100._0_8_ +
            dVar2 * local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[4]) +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] *
            (auVar101._0_8_ +
            dVar49 * local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[4] + auVar102._0_8_) +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] * (auVar104._0_8_ + auVar105._0_8_ + auVar103._0_8_);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar107;
  dVar107 = dVar107 + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[2] *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[0] +
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[5] *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1] +
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[8] *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[2]) * auVar267._0_8_ +
                      (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[2] *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3] +
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[8] *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[5] +
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[5] *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4]) * auVar267._8_8_ +
                      (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[2] *
                       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6] +
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[8] *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8] +
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[5] *
                      (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7]) *
                      local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar107;
  auVar98 = vmulsd_avx512f(auVar589,auVar108);
  dVar109 = auVar98._0_8_;
  auVar98 = vmulsd_avx512f(ZEXT816(0x4000000000000000),auVar108);
  auVar108._8_8_ = 0;
  auVar108._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar548._8_8_ = 0;
  auVar548._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] * -2.0;
  auVar100 = vmulsd_avx512f(auVar548,auVar108);
  auVar575._8_8_ = 0;
  auVar575._0_8_ =
       auVar98._0_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar100 = vaddsd_avx512f(auVar575,auVar100);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar101 = vmulsd_avx512f(auVar98,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar102 = vmulsd_avx512f(auVar548,auVar36);
  auVar101 = vaddsd_avx512f(auVar101,auVar102);
  auVar576._8_8_ = 0;
  auVar576._0_8_ =
       dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3];
  auVar101 = vaddsd_avx512f(auVar576,auVar101);
  dVar107 = dVar107 + (dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[0] + auVar100._0_8_) *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2] +
                      auVar101._0_8_ *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[5] +
                      (dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                                 .m_storage.m_data.array[6] +
                      auVar98._0_8_ *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[7] +
                      local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[4] * -2.0 *
                      (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[8]) *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[8];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar107;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = auVar267._8_8_;
  auVar553._8_8_ = 0;
  auVar553._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar98 = vxorpd_avx512vl(ZEXT816(0xc000000000000000),auVar99);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar100 = vmulsd_avx512f(auVar553,auVar37);
  auVar577._8_8_ = 0;
  auVar577._0_8_ =
       auVar98._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar100 = vsubsd_avx512f(auVar577,auVar100);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar101 = vmulsd_avx512f(auVar549,auVar38);
  auVar100 = vsubsd_avx512f(auVar100,auVar101);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar101 = vmulsd_avx512f(auVar98,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar102 = vmulsd_avx512f(auVar553,auVar40);
  auVar101 = vsubsd_avx512f(auVar101,auVar102);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar102 = vmulsd_avx512f(auVar549,auVar41);
  auVar101 = vsubsd_avx512f(auVar101,auVar102);
  vmovsd_avx512f(auVar101);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar102 = vmulsd_avx512f(auVar553,auVar42);
  auVar567._8_8_ = 0;
  auVar567._0_8_ =
       auVar98._0_8_ *
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar98 = vsubsd_avx512f(auVar567,auVar102);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar102 = vmulsd_avx512f(auVar549,auVar43);
  auVar98 = vsubsd_avx512f(auVar98,auVar102);
  auVar101 = vmulsd_avx512f(auVar541,auVar101);
  dVar107 = dVar107 + auVar101._0_8_ +
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6] * auVar98._0_8_ +
                      auVar100._0_8_ *
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar107;
  auVar542._8_8_ = 0;
  auVar542._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar545._8_8_ = 0;
  auVar545._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar558._8_8_ = 0;
  auVar558._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar98 = vxorpd_avx512vl(auVar558,auVar99);
  dVar109 = auVar98._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmulsd_avx512f(auVar545,auVar44);
  auVar578._8_8_ = 0;
  auVar578._0_8_ =
       dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5];
  auVar98 = vsubsd_avx512f(auVar578,auVar98);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar100 = vmulsd_avx512f(auVar542,auVar45);
  auVar98 = vsubsd_avx512f(auVar98,auVar100);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar100 = vmulsd_avx512f(auVar545,auVar46);
  auVar559._8_8_ = 0;
  auVar559._0_8_ =
       dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8];
  auVar100 = vsubsd_avx512f(auVar559,auVar100);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar101 = vmulsd_avx512f(auVar542,auVar47);
  auVar100 = vsubsd_avx512f(auVar100,auVar101);
  dVar107 = dVar107 + ((dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                  ).m_storage.m_data.array[2] -
                       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[4] *
                       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[1]) -
                      local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] *
                      (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0]) * auVar267._0_8_ +
                      auVar98._0_8_ * auVar267._8_8_ +
                      auVar100._0_8_ *
                      local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar107;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       dVar107 + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] *
                 (auVar267._8_8_ *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
                 local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2] * -2.0) +
                 local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] *
                 (auVar267._8_8_ *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[3] +
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5] * -2.0 +
                 local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4]) +
                 local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] *
                 (local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[4] *
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[7] +
                  (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8] * -2.0 +
                 auVar267._8_8_ *
                 (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6]);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * auVar539._0_8_ +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) * 2.0 +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) *
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
             .array[4];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[1] +
       auVar539._8_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] +
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
       auVar539._8_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
       auVar539._8_8_ *
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) * auVar267._0_8_ +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) * 2.0 +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  dVar109 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] * -2.0;
  dVar107 = auVar539._8_8_ + auVar539._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       ((dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
        dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * -4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] +
       ((dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] -
        dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5]) -
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * -4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] +
       ((dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] -
        dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8]) -
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * -4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[8] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = auVar539._0_8_;
  auVar98 = vxorpd_avx512vl(auVar114,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        auVar267._8_8_ *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              auVar267._8_8_ *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] *
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              auVar267._8_8_ *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] *
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  auVar115._8_8_ = 0;
  auVar115._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar98 = vxorpd_avx512vl(auVar115,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] *
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3]) * auVar267._0_8_ +
             ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] *
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) * 2.0 +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + auVar267._8_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              auVar539._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             auVar267._8_8_ *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             auVar539._0_8_ *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             auVar267._8_8_ *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             auVar539._0_8_ *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * -2.0 +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) * auVar539._8_8_ +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) * -2.0 +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
  dVar2 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[5] * -2.0;
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] -
        dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] -
              dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[5]) -
             dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] -
              dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) -
             dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  auVar116._8_8_ = 0;
  auVar116._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar98 = vxorpd_avx512vl(auVar116,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0] * 2.0) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] * 2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] * 2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  auVar117._8_8_ = 0;
  auVar117._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar98 = vxorpd_avx512vl(auVar117,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] *
        (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] *
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3]) * -2.0 +
             ((dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[1] *
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * 2.0 +
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[1] +
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] * 2.0 +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             ((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] * 2.0 +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[4] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [8] = (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar118._8_8_ = 0;
  auVar118._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar118,auVar99);
  dVar107 = auVar98._0_8_;
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [8] = ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] +
        ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] +
        ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[8];
  auVar119._8_8_ = 0;
  auVar119._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar98 = vxorpd_avx512vl(auVar119,auVar99);
  dVar107 = auVar98._0_8_;
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [8] = ((dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] *
                (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] +
        ((dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] *
                (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] +
        ((dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] *
                (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] +
        (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[8];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [8] = (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4] *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7] *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4] *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7] *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4] *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7] *
               (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[8];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (auVar539._0_8_ *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] * 2.0 +
              local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + (auVar539._0_8_ *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] * 2.0 +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             (auVar539._0_8_ *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] * 2.0 +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * auVar267._8_8_ +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) *
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) * -2.0 +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  auVar120._8_8_ = 0;
  auVar120._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar98 = vxorpd_avx512vl(auVar120,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1] * 2.0) -
       auVar539._0_8_ *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] +
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] * 2.0) -
       auVar539._0_8_ *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7] * 2.0) -
       auVar539._0_8_ *
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  auVar121._8_8_ = 0;
  auVar121._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar121,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * auVar267._0_8_ +
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) * auVar267._8_8_ +
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[6]) *
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
             .array[8];
  dVar107 = auVar267._8_8_ + auVar267._8_8_;
  dVar109 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] * -2.0;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [2] * -4.0) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4] -
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] * -4.0) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] -
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] * -4.0) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (auVar267._8_8_ *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] * -2.0) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (auVar267._8_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5] * -2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             (auVar267._8_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8] * -2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * auVar267._0_8_ +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) * auVar267._8_8_ +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) *
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
             .array[8];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[1] +
       auVar539._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] +
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
       auVar539._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] +
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
       auVar539._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) * auVar267._8_8_ +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) * auVar539._0_8_ +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  auVar122._8_8_ = 0;
  auVar122._0_8_ = auVar539._8_8_;
  auVar98 = vxorpd_avx512vl(auVar122,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0] * -2.0) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] * -2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] * -2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  auVar123._8_8_ = 0;
  auVar123._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar123,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3]) * auVar267._0_8_ +
             ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) * 2.0 +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
  dVar2 = auVar267._8_8_ * -2.0;
  dVar109 = auVar539._0_8_ + auVar539._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[5]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + auVar267._8_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              auVar539._0_8_ *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             auVar267._8_8_ *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             auVar539._0_8_ *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             auVar267._8_8_ *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             auVar539._0_8_ *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) * auVar267._0_8_ +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) * 2.0 +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * 2.0 +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  auVar124._8_8_ = 0;
  auVar124._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar124,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  auVar125._8_8_ = 0;
  auVar125._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar125,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3]) * -2.0 +
             ((dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] * -2.0;
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
        dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       * 4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] +
       ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] -
        dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5]) -
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       * 4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[4] +
       ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] -
        dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8]) -
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       * 4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[7] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * 2.0 +
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[1] +
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] * 2.0 +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             ((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] * 2.0 +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[8] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] *
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[7] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) * -2.0 +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] *
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [8];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [5] = (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6] *
               (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * -2.0;
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [5] = ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[1] -
         dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2]) -
        dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] +
        ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[4] -
         dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5]) -
        dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[3]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] +
        ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[7] -
         dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8]) -
        dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] +
        (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[5];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [5] = (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] +
        (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[5];
  dVar107 = auVar267._0_8_ + auVar267._0_8_;
  dVar109 = auVar267._8_8_ + auVar267._8_8_;
  dVar2 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] +
          local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
       dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
       dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[3] +
             dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
             dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[6] +
             dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] +
             dVar2 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6];
  dVar107 = auVar267._0_8_ + auVar267._0_8_;
  dVar2 = auVar267._8_8_ * -2.0;
  dVar109 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[5]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [5];
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * -2.0;
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) * auVar539._0_8_ +
       ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3]) * 2.0 +
       ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[8]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6]) *
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
             .array[5];
  dVar107 = auVar539._0_8_ + auVar539._0_8_;
  dVar109 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       * 4.0 + dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[3] +
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] * 4.0 +
             dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[6] +
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] * 4.0 +
             dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [5];
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = auVar267._0_8_ + auVar267._0_8_;
  local_348.m_other = (double)&local_538;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
       dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       * 4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0] +
       (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[3] +
       dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] +
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
       * 4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] +
       (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[6] +
       dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[7] +
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       * 4.0) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6];
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = auVar267._0_8_ * -2.0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [2] * 4.0) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4] -
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] * 4.0) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             ((dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] -
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] * 4.0) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [5];
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * -2.0;
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) * -2.0 +
       ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[4] -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[5]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] + ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) * auVar539._8_8_ +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [5];
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
  dVar109 = auVar539._8_8_ + auVar539._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * -4.0 +
       dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
       dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] * -4.0 +
             dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
             dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] * -4.0 +
             dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] +
             dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [5];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       * -4.0 + dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[3] +
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] * -4.0 +
             dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             (dVar107 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[6] +
             (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] * -4.0 +
             dVar109 * (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       (((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] * 4.0 -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + (((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] * 4.0 -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[5]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             (((zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] * 4.0 -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [5];
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * -2.0;
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] -
        dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[5]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             ((dVar2 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] -
              dVar109 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) -
             dVar107 * (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [5];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5];
  dVar2 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[8] +
          local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[5] =
       (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0] +
       dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] +
       dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2] + (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[3] +
             dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] +
             dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] +
             (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[6] +
             dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] +
             dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [5];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [9] = (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6] *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6] *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3] *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6] *
               (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar126._8_8_ = 0;
  auVar126._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar98 = vxorpd_avx512vl(auVar126,auVar99);
  dVar107 = auVar98._0_8_;
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [9] = ((dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0] *
                (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] +
        ((dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0] *
                (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] +
        ((dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0] *
                (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[9];
  auVar127._8_8_ = 0;
  auVar127._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar127,auVar99);
  dVar107 = auVar98._0_8_;
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [9] = ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] +
        ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [4]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] +
        ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8] -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [7]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] +
        (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[9];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [9] = (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] +
        (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] *
         (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8] *
               (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) *
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] +
        (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[9];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (auVar267._0_8_ *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + auVar267._8_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + (auVar267._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             auVar267._8_8_ *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             (auVar267._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             auVar267._8_8_ *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * auVar267._8_8_ +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) *
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) * -2.0 +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar107 = auVar267._0_8_ + auVar267._0_8_;
  dVar2 = auVar267._8_8_ * -2.0;
  dVar109 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[1] -
        dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[4] -
              dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[5]) -
             dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             ((dVar2 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[7] -
              dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) -
             dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  auVar128._8_8_ = 0;
  auVar128._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar98 = vxorpd_avx512vl(auVar128,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1] * 2.0) -
       auVar539._0_8_ *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] +
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4] * 2.0) -
       auVar539._0_8_ *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] +
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8] -
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [7] * 2.0) -
       auVar539._0_8_ *
       (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7] +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  auVar129._8_8_ = 0;
  auVar129._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar129,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * auVar267._8_8_ +
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) *
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4] + ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) * -2.0 +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (auVar539._0_8_ *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] * 2.0 +
              local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (auVar539._0_8_ *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] * 2.0 +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             (auVar539._0_8_ *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] * 2.0 +
             local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * auVar267._0_8_ +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) * auVar267._8_8_ +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8]) *
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] + (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
             .array[9];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + auVar267._0_8_ *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2] * 2.0) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             auVar267._0_8_ *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5] * 2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             (local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             auVar267._0_8_ *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8] * 2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) * auVar267._8_8_ +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) * auVar539._0_8_ +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = auVar267._0_8_ * -2.0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
        (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [2] * 4.0) -
       dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[4] -
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5] * 4.0) -
             dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             ((dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[7] -
              (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[8] * 4.0) -
             dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  auVar130._8_8_ = 0;
  auVar130._0_8_ = auVar539._8_8_;
  auVar98 = vxorpd_avx512vl(auVar130,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0] * -2.0) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3] * -2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6] * -2.0) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  auVar131._8_8_ = 0;
  auVar131._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar131,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3]) * auVar267._8_8_ +
             ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) * auVar539._0_8_ +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[1] +
       auVar539._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] +
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
       auVar539._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
       ((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [6] * -2.0 +
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5] * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
       auVar539._8_8_ *
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
       ) * local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) * auVar267._0_8_ +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) * 2.0 +
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] * -2.0 +
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] * -2.0 +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] * -2.0 +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) * 2.0 +
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] *
        (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[3] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[5]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0] *
              (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [1] * 4.0 -
        dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[2]) -
       dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] * 4.0 -
              dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[5]) -
             dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             (((yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] * 4.0 -
              dVar109 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data.array[8]) -
             dVar107 * (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                       .m_data.array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  auVar132._8_8_ = 0;
  auVar132._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar132,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1] + ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[5] -
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[4]) -
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[3]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[4] +
             ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar98 = vxorpd_avx512vl(auVar133,auVar99);
  dVar107 = auVar98._0_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [1]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[0]) * 2.0 +
       ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] -
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] *
        (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [4]) - local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[2] *
               (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[3]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + ((dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[8] -
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[7]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[2] *
             (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[6]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[3] +
             (local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[9] =
       (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] *
        (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
        [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[1] +
              local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[2]) *
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0] + (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[3] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[4] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[5]) * -2.0 +
             (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] *
              (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
              array[6] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[5] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[7] +
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[8]) *
             local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] +
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [10] = (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] *
          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[4] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[1] +
                local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[7] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[2]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] *
          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[4] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4] +
                local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[7] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[5]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] *
          (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[4] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7] +
                local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[7] *
                (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[8]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * -2.0;
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [10] = ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[0]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[3]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [10] = (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] *
          (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[1] +
                local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[2]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] *
          (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[4] +
                local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[5]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         (local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] *
          (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6] + local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[7] +
                local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6] *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[8]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = auVar267._8_8_ + auVar267._8_8_;
  dVar109 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[0] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] +
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [2] * -4.0) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[3] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] +
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [5] * -4.0) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[6] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] +
         (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8] * -4.0) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
  dVar107 = auVar267._0_8_ + auVar267._0_8_;
  dVar2 = auVar267._8_8_ * -2.0;
  dVar109 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[0]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[3]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * -2.0;
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[0]) * auVar267._8_8_ +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[3]) *
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6]) * -2.0 +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = auVar267._0_8_ + auVar267._0_8_;
  dVar109 = auVar267._8_8_ + auVar267._8_8_;
  dVar2 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] +
          local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[0] +
         dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] +
         dVar2 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[3] +
         dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] +
         dVar2 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[6] +
         dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] +
         dVar2 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1];
  dVar109 = auVar267._8_8_ + auVar267._8_8_;
  dVar2 = auVar539._0_8_ + auVar539._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[0] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] +
         dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[2]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[3] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] +
         dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[5]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         (dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[6] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] +
         dVar2 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[8]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = auVar267._0_8_ * -2.0;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = ((dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[1] -
          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2] * 4.0) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[0]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         ((dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[4] -
          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5] * 4.0) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[3]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         ((dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[7] -
          (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8] * 4.0) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * -2.0;
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[0]) *
         local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[3]) * auVar267._8_8_ +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6]) * auVar539._0_8_ +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = auVar267._0_8_ + auVar267._0_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[0] +
         dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] +
         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [2] * 4.0) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[3] +
         dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] +
         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [5] * 4.0) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         (dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[6] +
         dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] +
         (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
         [8] * 4.0) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0] * 4.0 +
         dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[2]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3] * 4.0 +
         dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         ((xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [6] * 4.0 +
         dVar107 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] +
         dVar109 * (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[8]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = (((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1] * 4.0 -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[0]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         (((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4] * 4.0 -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[3]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         (((xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7] * 4.0 -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6]) *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar2 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[3] * -2.0;
  dVar109 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[1] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[2]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[0]) * 2.0 +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[4] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[5]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[3]) *
         local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         ((dVar2 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[7] -
          dVar109 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[8]) -
         dVar107 * (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[6]) *
         local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0];
  dVar109 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
  local_110._0_8_ =
       dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[0] +
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
       * -4.0 + dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[2];
  local_110._8_8_ =
       dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[3] +
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
       * -4.0 + dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[5];
  auStack_100._0_8_ =
       dVar107 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                 m_data.array[6] +
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
       * -4.0 + dVar109 * (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[8];
  auStack_100._8_8_ = local_348.m_other;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[10]
       = (double)local_110._0_8_ *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         (double)local_110._8_8_ *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         (double)auStack_100._0_8_ *
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[10];
  dVar107 = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
            m_data.array[8];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [1] = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[4];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [2] = dVar107;
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [6] = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[9];
  dVar107 = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[8];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar107;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar107 = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[8];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar107;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  dVar107 = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[8];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[1] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [4];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[2] =
       dVar107;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[6] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [9];
  auVar59._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar59._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar59._16_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar59._24_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar59._32_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar59._40_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar59._48_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar59._56_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array.
  _0_64_ = vpermpd_avx512f(_DAT_0025b7c0,auVar59);
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y1P;
  local_310 = y1P;
  local_308 = 3;
  local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[0] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[1] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[2] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[3] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[4] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[5] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[6] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[7] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  auVar92._8_8_ = auVar267._8_8_;
  auVar92._0_8_ = auVar267._0_8_;
  auVar92._16_8_ = auVar539._0_8_;
  auVar92._24_8_ = auVar267._8_8_;
  auVar92._32_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar92._40_8_ = 0x4000000000000000;
  auVar92._48_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar92._56_8_ = 0xc000000000000000;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array.
  _0_64_ = vpermpd_avx512f(_DAT_0025b7c0,auVar92);
  auVar85._16_8_ = 0xc000000000000000;
  auVar85._0_16_ = auVar51;
  auVar85._24_8_ = auVar267._0_8_;
  auVar85._32_8_ = auVar267._8_8_;
  auVar85._40_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar85._48_8_ = 0x4000000000000000;
  auVar85._56_8_ = auVar539._0_8_;
  local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array.
  _0_64_ = vpermpd_avx512f(_DAT_0025b7c0,auVar85);
  auVar78._8_8_ = 0x4000000000000000;
  auVar78._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar78._16_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar78._24_8_ = 0xc000000000000000;
  auVar78._32_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar78._40_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar78._48_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6];
  auVar78._56_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7];
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array.
  _0_64_ = vpermpd_avx512f(_DAT_0025b7c0,auVar78);
  local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8];
  dStack_230 = 2.0;
  dStack_220 = -2.0;
  local_2a8 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0];
  dStack_2a0 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1];
  local_298 = -2.0;
  local_278 = 2.0;
  dStack_2f0 = 2.0;
  dStack_2e0 = -2.0;
  dStack_2d0 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5];
  local_2c8 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6];
  dStack_2c0 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7];
  local_2b8 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8];
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       auVar267._0_8_;
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       auVar267._8_8_;
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       auVar539._0_8_;
  local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       auVar539._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       auVar267._0_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       auVar267._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       auVar539._0_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       auVar267._8_8_;
  local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  local_360 = yyF;
  local_320 = (double *)local_358._0_8_;
  local_2f8 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[0];
  local_2e8 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2];
  dStack_2d8 = local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0];
  dStack_290 = auVar267._0_8_;
  dStack_288 = auVar267._8_8_;
  dStack_280 = local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[5];
  dStack_270 = auVar539._0_8_;
  local_268 = auVar539._8_8_;
  local_258 = auVar267._0_8_;
  dStack_250 = auVar267._8_8_;
  local_248 = auVar539._0_8_;
  dStack_240 = auVar267._8_8_;
  dStack_238 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[4];
  local_228 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[6];
  local_218 = local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[4];
  local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       auVar539._8_8_;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array[8] =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  pMVar97 = local_540;
  local_c8 = &local_498;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xc] = *local_570.data;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y2P;
  local_310 = y2P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xc] = *local_570.data +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xc];
  auVar60._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar60._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar60,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar141._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar141._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar141);
  auVar142._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar142._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar271._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar271._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar142,auVar271);
  auVar143._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar143._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar272._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar272._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar143,auVar272);
  auVar273._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar273._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar399._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar399._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar273,auVar399);
  auVar400._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar400._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar488._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar488._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar400,auVar488);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xc] = ((dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x18] +
           dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x19]) -
          local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[7] *
          (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[8] +
          (double)local_110._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[0] +
          auVar100._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[2] +
          auVar101._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[4] +
          auVar98._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[6] +
          (double)local_110._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[1] +
          auVar100._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[3] +
          auVar101._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[5] +
          auVar98._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[7] +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xc];
  auVar61._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar61._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar61,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar144._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar144._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar144);
  auVar145._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar145._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar274._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar274._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar145,auVar274);
  auVar146._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar146._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar275._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar275._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar146,auVar275);
  auVar276._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar276._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar401._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar401._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar276,auVar401);
  auVar402._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar402._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar489._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar489._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar402,auVar489);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xc] = local_d0 *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[8] +
          (double)local_110._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[0] +
          auStack_100._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[2] +
          auStack_f0._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[4] +
          auStack_e0._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[6] +
          (double)local_110._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[1] +
          auStack_100._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[3] +
          auStack_f0._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[5] +
          auStack_e0._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[7] +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xc];
  local_358._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_3a8;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y1P;
  local_310 = y1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_498;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y1P;
  local_310 = y1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_258;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_218 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_258 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_248 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_238 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_228 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_250 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_240 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_230 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_220;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_358._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_3a8;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y2P;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_310 = y2P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y2P;
  local_310 = y2P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_168;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar93._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar93._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar93,local_3a8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar147._0_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar147._8_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar147);
  auVar148._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar148._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar277._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar277._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar148,auVar277);
  auVar149._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar149._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar278._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar278._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar149,auVar278);
  auVar279._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar279._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar403._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar403._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar279,auVar403);
  auVar404._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar404._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar490._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar490._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar404,auVar490);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar62._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar62._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar62,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar150._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar150._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar150);
  auVar151._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar151._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar280._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar280._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar151,auVar280);
  auVar152._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar152._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar281._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar281._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar152,auVar281);
  auVar282._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar282._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar405._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar405._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar282,auVar405);
  auVar406._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar406._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar491._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar491._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar406,auVar491);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_218 +
         (double)local_110._0_8_ * local_258 + auVar100._0_8_ * local_248 +
         auVar101._0_8_ * dStack_238 + auVar98._0_8_ * local_228 +
         (double)local_110._8_8_ * dStack_250 + auVar100._8_8_ * dStack_240 +
         auVar101._8_8_ * dStack_230 + auVar98._8_8_ * dStack_220 +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar94._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar94._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar94,local_3a8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar153._0_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar153._8_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar153);
  auVar154._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar154._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar283._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar283._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar154,auVar283);
  auVar155._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar155._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar284._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar284._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar155,auVar284);
  auVar285._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar285._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar407._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar407._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar285,auVar407);
  auVar408._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar408._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar492._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar492._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar408,auVar492);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar63._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar63._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar63,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar156._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar156._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar156);
  auVar157._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar157._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar286._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar286._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar157,auVar286);
  auVar158._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar158._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar287._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar287._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar158,auVar287);
  auVar288._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar288._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar409._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar409._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar288,auVar409);
  auVar410._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar410._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar493._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar493._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar410,auVar493);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = local_d0 *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8] +
         (double)local_110._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auStack_100._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auStack_f0._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auStack_e0._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auStack_100._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auStack_f0._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auStack_e0._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_358._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_3f8;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y1P;
  local_310 = y1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_498;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y1P;
  local_310 = y1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2a8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_268 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_2a8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_298 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_288 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_278 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_2a0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_290 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_280 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_270;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_358._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_3f8;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y2P;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_310 = y2P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y2P;
  local_310 = y2P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_1b8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar86._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar86._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar86,local_3f8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar159._0_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar159._8_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar159);
  auVar160._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar160._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar289._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar289._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar160,auVar289);
  auVar161._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar161._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar290._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar290._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar161,auVar290);
  auVar291._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar291._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar411._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar411._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar291,auVar411);
  auVar412._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar412._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar494._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar494._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar412,auVar494);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar64._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar64._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar64,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar162._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar162._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar162);
  auVar163._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar163._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar292._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar292._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar163,auVar292);
  auVar164._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar164._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar293._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar293._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar164,auVar293);
  auVar294._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar294._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar413._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar413._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar294,auVar413);
  auVar414._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar414._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar495._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar495._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar414,auVar495);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_268 +
         (double)local_110._0_8_ * local_2a8 + auVar100._0_8_ * local_298 +
         auVar101._0_8_ * dStack_288 + auVar98._0_8_ * local_278 +
         (double)local_110._8_8_ * dStack_2a0 + auVar100._8_8_ * dStack_290 +
         auVar101._8_8_ * dStack_280 + auVar98._8_8_ * dStack_270 +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar87._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar87._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar87,local_3f8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar165._0_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar165._8_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar165);
  auVar166._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar166._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar295._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar295._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar166,auVar295);
  auVar167._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar167._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar296._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar296._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar167,auVar296);
  auVar297._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar297._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar415._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar415._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar297,auVar415);
  auVar416._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar416._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar496._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar496._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar416,auVar496);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar65._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar65._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar65,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar168._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar168._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar168);
  auVar169._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar169._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar298._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar298._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar169,auVar298);
  auVar170._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar170._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar299._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar299._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar170,auVar299);
  auVar300._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar300._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar417._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar417._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar300,auVar417);
  auVar418._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar418._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar497._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar497._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar418,auVar497);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = local_d0 *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8] +
         (double)local_110._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auStack_100._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auStack_f0._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auStack_e0._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auStack_100._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auStack_f0._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auStack_e0._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_358._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_448;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y1P;
  local_310 = y1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_498;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y1P;
  local_310 = y1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2f8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_2b8 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_2f8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_2e8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_2d8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_2c8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_2f0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_2e0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_2d0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_2c0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_358._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_448;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y2P;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_310 = y2P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 2;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(2);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = y2P;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_310 = y2P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_208;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar79._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar79._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar79,local_448.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar171._0_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar171._8_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar171);
  auVar172._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar172._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar301._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar301._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar172,auVar301);
  auVar173._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar173._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar302._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar302._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar173,auVar302);
  auVar303._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar303._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar419._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar419._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar303,auVar419);
  auVar420._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar420._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar498._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar498._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar420,auVar498);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar66._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar66._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar66,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar174._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar174._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar174);
  auVar175._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar175._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar304._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar304._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar175,auVar304);
  auVar176._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar176._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar305._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar305._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar176,auVar305);
  auVar306._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar306._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar421._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar421._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar306,auVar421);
  auVar422._0_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar422._8_8_ =
       dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar499._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar499._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar422,auVar499);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_2b8 +
         (double)local_110._0_8_ * local_2f8 + auVar100._0_8_ * local_2e8 +
         auVar101._0_8_ * dStack_2d8 + auVar98._0_8_ * local_2c8 +
         (double)local_110._8_8_ * dStack_2f0 + auVar100._8_8_ * dStack_2e0 +
         auVar101._8_8_ * dStack_2d0 + auVar98._8_8_ * dStack_2c0 +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar80._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar80._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar80,local_448.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar177._0_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar177._8_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar177);
  auVar178._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar178._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar307._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar307._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar178,auVar307);
  auVar179._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar179._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar308._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar308._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar179,auVar308);
  auVar309._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar309._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar423._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar423._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar309,auVar423);
  auVar424._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar424._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar500._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar500._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar424,auVar500);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = ((dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  auVar67._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar67._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar98 = vmovhpd_avx(auVar67,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[4]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar180._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  auVar180._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7];
  vmovlpd_avx(auVar180);
  auVar181._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar181._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar310._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar310._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar181,auVar310);
  auVar182._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar182._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar311._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar311._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar182,auVar311);
  auVar312._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar312._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar425._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar425._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar312,auVar425);
  auVar426._0_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar426._8_8_ =
       dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar501._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._0_8_;
  auVar501._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [7] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar426,auVar501);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[7] *
             (z2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xc]
       = local_d0 *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8] +
         (double)local_110._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auStack_100._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auStack_f0._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auStack_e0._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auStack_100._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auStack_f0._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auStack_e0._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xc];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z1P;
  local_310 = z1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_358._0_8_ = &local_538;
  local_348.m_other = (double)&local_538;
  local_320 = (double *)&local_538;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  pMVar97 = local_540;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = *local_570.data;
  local_340 = ZEXT816(0) << 0x20;
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z2P;
  local_310 = z2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_358._0_8_ = &local_538;
  local_348.m_other = (double)&local_538;
  local_320 = (double *)&local_538;
  local_118 = (DstXprType *)local_110;
  local_c8 = &local_498;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = *local_570.data +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xd];
  auVar68._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar68._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar68,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar183._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar183._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar183);
  auVar184._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar184._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar313._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar313._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar184,auVar313);
  auVar185._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar185._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar314._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar314._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar185,auVar314);
  auVar315._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar315._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar427._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar427._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar315,auVar427);
  auVar428._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar428._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar502._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar502._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar428,auVar502);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = ((dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x18] +
           dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x19]) -
          local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[8] *
          (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[8] +
          (double)local_110._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[0] +
          auVar100._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[2] +
          auVar101._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[4] +
          auVar98._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[6] +
          (double)local_110._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[1] +
          auVar100._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[3] +
          auVar101._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[5] +
          auVar98._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[7] +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xd];
  auVar69._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar69._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar69,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar186._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar186._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar186);
  auVar187._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar187._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar316._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar316._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar187,auVar316);
  auVar188._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar188._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar317._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar317._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar188,auVar317);
  auVar318._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar318._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar429._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar429._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar318,auVar429);
  auVar430._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar430._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar503._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar503._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar430,auVar503);
  auVar59 = _local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_d0 = (dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xd] = local_d0 *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[8] +
          (double)local_110._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[0] +
          auStack_100._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[2] +
          auStack_f0._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[4] +
          auStack_e0._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[6] +
          (double)local_110._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[1] +
          auStack_100._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[3] +
          auStack_f0._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[5] +
          auStack_e0._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[7] +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xd];
  local_358._0_8_ = &local_3a8;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z1P;
  local_310 = z1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_498;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data;
  local_358._0_8_ = &local_538;
  local_340 = ZEXT816(0) << 0x20;
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z1P;
  local_310 = z1P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_258;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_218 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_258 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_248 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_238 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_228 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_250 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_240 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_230 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_220;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_358._0_8_ = &local_3a8;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z2P;
  local_310 = z2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_358._0_8_ = &local_538;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z2P;
  local_310 = z2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_168;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar95._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar95._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar95,local_3a8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar189._0_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar189._8_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar189);
  auVar190._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar190._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar319._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar319._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar190,auVar319);
  auVar191._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar191._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar320._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar320._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar191,auVar320);
  auVar321._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar321._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar431._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar431._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar321,auVar431);
  auVar432._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar432._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar504._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar504._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar432,auVar504);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar70._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar70._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar70,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar192._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar192._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar192);
  auVar193._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar193._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar322._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar322._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar193,auVar322);
  auVar194._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar194._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar323._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar323._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar194,auVar323);
  auVar324._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar324._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar433._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar433._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar324,auVar433);
  auVar434._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar434._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar505._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar505._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar434,auVar505);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_218 +
         (double)local_110._0_8_ * local_258 + auVar100._0_8_ * local_248 +
         auVar101._0_8_ * dStack_238 + auVar98._0_8_ * local_228 +
         (double)local_110._8_8_ * dStack_250 + auVar100._8_8_ * dStack_240 +
         auVar101._8_8_ * dStack_230 + auVar98._8_8_ * dStack_220 +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar96._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar96._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar96,local_3a8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar195._0_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar195._8_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar195);
  auVar196._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar196._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar325._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar325._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar196,auVar325);
  auVar197._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar197._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar326._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar326._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar197,auVar326);
  auVar327._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar327._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar435._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar435._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar327,auVar435);
  auVar436._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar436._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar506._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar506._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar436,auVar506);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar71._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar71._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar71,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar198._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar198._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar198);
  auVar199._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar199._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar328._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar328._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar199,auVar328);
  auVar200._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar200._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar329._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar329._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar200,auVar329);
  auVar330._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar330._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar437._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar437._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar330,auVar437);
  auVar438._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar438._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar507._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar507._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar438,auVar507);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = local_d0 *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8] +
         (double)local_110._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auStack_100._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auStack_f0._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auStack_e0._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auStack_100._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auStack_f0._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auStack_e0._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_570.data = &local_568;
  local_358._0_8_ = &local_3f8;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z1P;
  local_310 = z1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data;
  local_358._0_8_ = &local_538;
  local_340 = ZEXT816(0) << 0x20;
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z1P;
  local_310 = z1P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  local_c8 = &local_498;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2a8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_268 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_2a8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_298 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_288 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_278 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_2a0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_290 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_280 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_270;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_358._0_8_ = &local_3f8;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z2P;
  local_310 = z2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_358._0_8_ = &local_538;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z2P;
  local_310 = z2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_1b8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar88._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar88._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar88,local_3f8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar201._0_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar201._8_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar201);
  auVar202._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar202._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar331._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar331._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar202,auVar331);
  auVar203._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar203._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar332._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar332._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar203,auVar332);
  auVar333._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar333._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar439._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar439._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar333,auVar439);
  auVar440._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar440._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar508._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar508._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar440,auVar508);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar72._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar72._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar72,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar204._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar204._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar204);
  auVar205._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar205._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar334._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar334._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar205,auVar334);
  auVar206._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar206._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar335._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar335._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar206,auVar335);
  auVar336._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar336._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar441._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar441._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar336,auVar441);
  auVar442._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar442._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar509._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar509._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar442,auVar509);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_268 +
         (double)local_110._0_8_ * local_2a8 + auVar100._0_8_ * local_298 +
         auVar101._0_8_ * dStack_288 + auVar98._0_8_ * local_278 +
         (double)local_110._8_8_ * dStack_2a0 + auVar100._8_8_ * dStack_290 +
         auVar101._8_8_ * dStack_280 + auVar98._8_8_ * dStack_270 +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar89._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar89._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar89,local_3f8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar207._0_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar207._8_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar207);
  auVar208._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar208._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar337._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar337._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar208,auVar337);
  auVar209._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar209._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar338._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar338._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar209,auVar338);
  auVar339._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar339._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar443._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar443._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar339,auVar443);
  auVar444._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar444._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar510._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar510._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar444,auVar510);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar73._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar73._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar73,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar210._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar210._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar210);
  auVar211._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar211._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar340._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar340._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar211,auVar340);
  auVar212._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar212._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar341._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar341._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar212,auVar341);
  auVar342._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar342._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar445._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar445._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar342,auVar445);
  auVar446._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar446._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar511._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar511._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar446,auVar511);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = local_d0 *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8] +
         (double)local_110._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auStack_100._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auStack_f0._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auStack_e0._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auStack_100._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auStack_f0._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auStack_e0._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_570.data = &local_568;
  local_358._0_8_ = &local_448;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z1P;
  local_310 = z1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data;
  local_358._0_8_ = &local_538;
  local_340 = ZEXT816(0) << 0x20;
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z1P;
  local_310 = z1P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  local_c8 = &local_498;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2f8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_2b8 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_2f8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_2e8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_2d8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_2c8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_2f0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_2e0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_2d0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_2c0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_358._0_8_ = &local_448;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z2P;
  local_310 = z2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_358._0_8_ = &local_538;
  local_340 = ZEXT816(0);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = z2P;
  local_310 = z2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)local_358._0_8_;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_208;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar81._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar81._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar81,local_448.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar213._0_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar213._8_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar213);
  auVar214._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar214._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar343._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar343._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar214,auVar343);
  auVar215._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar215._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar344._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar344._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar215,auVar344);
  auVar345._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar345._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar447._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar447._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar345,auVar447);
  auVar448._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar448._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar512._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar512._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar448,auVar512);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  auVar74._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar74._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar74,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar216._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar216._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar216);
  auVar217._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar217._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar346._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar346._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar217,auVar346);
  auVar218._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar218._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar347._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar347._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar218,auVar347);
  auVar348._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar348._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar449._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar449._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar348,auVar449);
  auVar450._0_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar450._8_8_ =
       dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar513._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar513._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar450,auVar513);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_2b8 +
         (double)local_110._0_8_ * local_2f8 + auVar100._0_8_ * local_2e8 +
         auVar101._0_8_ * dStack_2d8 + auVar98._0_8_ * local_2c8 +
         (double)local_110._8_8_ * dStack_2f0 + auVar100._8_8_ * dStack_2e0 +
         auVar101._8_8_ * dStack_2d0 + auVar98._8_8_ * dStack_2c0 +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar82._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar82._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar82,local_448.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar219._0_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar219._8_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar219);
  auVar220._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar220._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar349._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar349._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar220,auVar349);
  auVar221._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar221._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar350._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar350._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar221,auVar350);
  auVar351._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar351._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar451._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar451._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar351,auVar451);
  auVar452._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar452._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar514._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar514._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar452,auVar514);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = ((dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  auVar75._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar75._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar98 = vmovhpd_avx(auVar75,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[5]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar222._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  auVar222._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8];
  vmovlpd_avx(auVar222);
  auVar223._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar223._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar352._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar352._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar223,auVar352);
  auVar224._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar224._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar353._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar353._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar224,auVar353);
  auVar354._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar354._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar453._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar453._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar354,auVar453);
  auVar454._0_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar454._8_8_ =
       dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar515._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._0_8_;
  auVar515._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [8] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar454,auVar515);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[8] *
             (x2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xd]
       = local_d0 *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8] +
         (double)local_110._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auStack_100._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auStack_f0._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auStack_e0._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auStack_100._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auStack_f0._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auStack_e0._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xd];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x1P;
  local_310 = x1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)&local_538;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  pMVar97 = local_540;
  local_c8 = &local_498;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = *local_570.data;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x2P;
  local_310 = x2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_348.m_other = (double)&local_538;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = *local_570.data +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xe];
  auVar51._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar51._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar51,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar225._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar225._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar225);
  auVar226._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar226._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar355._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar355._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar226,auVar355);
  auVar227._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar227._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar356._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar356._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar227,auVar356);
  auVar357._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar357._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar455._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar455._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar357,auVar455);
  auVar456._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar456._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar516._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar516._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar456,auVar516);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = ((dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                      m_data.array[0x18] +
           dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x19]) -
          local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[6] *
          (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage
                    .m_data.array[8] +
          (double)local_110._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[0] +
          auVar100._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[2] +
          auVar101._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[4] +
          auVar98._0_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[6] +
          (double)local_110._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[1] +
          auVar100._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[3] +
          auVar101._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[5] +
          auVar98._8_8_ *
          local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[7] +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xe];
  auVar52._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar52._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar52,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar228._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar228._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar228);
  auVar229._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar229._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar358._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar229,auVar358);
  auVar230._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar230._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar359._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar359._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar230,auVar359);
  auVar360._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar360._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar457._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar457._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar360,auVar457);
  auVar458._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar458._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar517._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar517._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar458,auVar517);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xe] = local_d0 *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[8] +
          (double)local_110._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[0] +
          auStack_100._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[2] +
          auStack_f0._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[4] +
          auStack_e0._0_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[6] +
          (double)local_110._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[1] +
          auStack_100._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[3] +
          auStack_f0._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[5] +
          auStack_e0._8_8_ *
          local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
          array[7] +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xe];
  local_358._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_3a8;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x1P;
  local_310 = x1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x1P;
  local_310 = x1P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  local_c8 = &local_498;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_258;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_218 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_258 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_248 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_238 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_228 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_250 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_240 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_230 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_220;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_358._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_3a8;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x2P;
  local_310 = x2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x2P;
  local_310 = x2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_168;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar90._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar90._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar90,local_3a8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar231._0_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar231._8_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar231);
  auVar232._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar232._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar361._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar361._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar232,auVar361);
  auVar233._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar233._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar362._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar362._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar233,auVar362);
  auVar363._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar363._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar459._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar459._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar363,auVar459);
  auVar460._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar460._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar518._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar518._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar460,auVar518);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar53._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar53._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar53,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar234._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar234._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar234);
  auVar235._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar235._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar364._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar364._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar235,auVar364);
  auVar236._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar236._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar365._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar365._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar236,auVar365);
  auVar366._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar366._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar461._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar461._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar366,auVar461);
  auVar462._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar462._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar519._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar519._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar462,auVar519);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_218 +
         (double)local_110._0_8_ * local_258 + auVar100._0_8_ * local_248 +
         auVar101._0_8_ * dStack_238 + auVar98._0_8_ * local_228 +
         (double)local_110._8_8_ * dStack_250 + auVar100._8_8_ * dStack_240 +
         auVar101._8_8_ * dStack_230 + auVar98._8_8_ * dStack_220 +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar91._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar91._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar91,local_3a8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar237._0_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar237._8_8_ =
       -local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar237);
  auVar238._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar238._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar367._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar367._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar238,auVar367);
  auVar239._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar239._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar368._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar368._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar239,auVar368);
  auVar369._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar369._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar463._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar463._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar369,auVar463);
  auVar464._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar464._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar520._0_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar520._8_8_ =
       local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar464,auVar520);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar54._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar54._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar54,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar240._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar240._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar240);
  auVar241._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar241._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar370._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar370._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar241,auVar370);
  auVar242._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar242._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar371._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar371._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar242,auVar371);
  auVar372._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar372._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar465._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar465._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar372,auVar465);
  auVar466._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar466._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar521._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar521._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar466,auVar521);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = local_d0 *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8] +
         (double)local_110._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auStack_100._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auStack_f0._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auStack_e0._0_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auStack_100._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auStack_f0._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auStack_e0._8_8_ *
         local_168.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_358._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_3f8;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x1P;
  local_310 = x1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_498;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x1P;
  local_310 = x1P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2a8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_268 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_2a8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_298 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_288 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_278 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_2a0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_290 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_280 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_270;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_358._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_3f8;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x2P;
  local_310 = x2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x2P;
  local_310 = x2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_1b8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar83._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar83._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar83,local_3f8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar243._0_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar243._8_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar243);
  auVar244._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar244._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar373._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar373._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar244,auVar373);
  auVar245._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar245._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar374._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar374._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar245,auVar374);
  auVar375._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar375._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar467._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar467._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar375,auVar467);
  auVar468._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar468._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar522._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar522._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar468,auVar522);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar55._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar55._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar55,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar246._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar246._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar246);
  auVar247._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar247._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar376._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar376._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar247,auVar376);
  auVar248._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar248._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar377._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar377._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar248,auVar377);
  auVar378._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar378._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar469._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar469._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar378,auVar469);
  auVar470._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar470._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar523._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar523._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar470,auVar523);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_268 +
         (double)local_110._0_8_ * local_2a8 + auVar100._0_8_ * local_298 +
         auVar101._0_8_ * dStack_288 + auVar98._0_8_ * local_278 +
         (double)local_110._8_8_ * dStack_2a0 + auVar100._8_8_ * dStack_290 +
         auVar101._8_8_ * dStack_280 + auVar98._8_8_ * dStack_270 +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar84._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar84._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar84,local_3f8.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar249._0_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar249._8_8_ =
       -local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar249);
  auVar250._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar250._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar379._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar379._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar250,auVar379);
  auVar251._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar251._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar380._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar380._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar251,auVar380);
  auVar381._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar381._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar471._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar471._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar381,auVar471);
  auVar472._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar472._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar524._0_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar524._8_8_ =
       local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar472,auVar524);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_3f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar56._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar56._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar56,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar252._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar252._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar252);
  auVar253._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[1]
  ;
  auVar253._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[4]
  ;
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar382._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar382._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  local_110 = vsubpd_avx(auVar253,auVar382);
  auVar254._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[7]
  ;
  auVar254._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar383._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar383._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_100 = vsubpd_avx(auVar254,auVar383);
  auVar384._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xd];
  auVar384._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar473._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar473._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_f0 = vsubpd_avx(auVar384,auVar473);
  auVar474._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x13];
  auVar474._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       (double)local_358._8_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar525._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar525._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auStack_e0 = vsubpd_avx(auVar474,auVar525);
  auVar59 = _local_110;
  local_d0 = (dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x18] +
             (double)local_358._8_8_ *
             (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x19]) -
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[6] *
             (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
             array[0x1a];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = local_d0 *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[8] +
         (double)local_110._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auStack_100._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auStack_f0._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auStack_e0._0_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auStack_100._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auStack_f0._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auStack_e0._8_8_ *
         local_1b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_358._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_448;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x1P;
  local_310 = x1P;
  local_308 = 3;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  _local_110 = auVar59;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data;
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x1P;
  local_310 = x1P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  local_c8 = &local_498;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2f8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) * local_2b8 +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] * local_2f8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) * local_2e8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) * dStack_2d8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) * local_2c8 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) * dStack_2f0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) * dStack_2e0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) * dStack_2d0 +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) * dStack_2c0;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_358._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_448;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x2P;
  local_310 = x2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_4e8;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_358._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       + 1;
  local_348.m_other = (double)&local_538;
  local_340 = ZEXT816(1);
  local_330 = (Matrix<double,_3,_9,_0,_3,_9> *)0x1;
  local_328 = x2P;
  local_310 = x2P;
  local_308 = 3;
  local_560.m_dst = (DstEvaluatorType *)&local_580;
  local_560.m_functor = (assign_op<double,_double> *)&local_578;
  local_580.data = (double *)local_110;
  local_570.data = &local_568;
  local_560.m_src = (SrcEvaluatorType *)local_358;
  local_560.m_dstExpr = (DstXprType *)local_110;
  local_320 = (double *)local_358._0_8_;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::
  copy_using_evaluator_LinearTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_560);
  local_c8 = &local_208;
  local_568 = *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x40) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[8] +
              (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
              m_data.array[0] *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[0] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x10) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[2] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x20) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[4] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x30) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[6] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 8) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[1] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x18) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[3] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x28) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[5] +
              *(double *)
               ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                      m_storage.m_data.array + 0x38) *
              local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
              m_data.array[7];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = *local_570.data +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar76._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar76._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar76,local_448.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar255._0_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar255._8_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar255);
  auVar256._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar256._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar385._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar385._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar256,auVar385);
  auVar257._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar257._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar386._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar386._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar257,auVar386);
  auVar387._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar387._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar475._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar475._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar387,auVar475);
  auVar476._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar476._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar526._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar526._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar476,auVar526);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar57._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar57._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar57,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar258._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar258._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar258);
  auVar259._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar259._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar388._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar388._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar259,auVar388);
  auVar260._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar260._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar389._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar389._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar260,auVar389);
  auVar390._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar390._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar477._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar477._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar390,auVar477);
  auVar478._0_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar478._8_8_ =
       dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar527._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar527._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar478,auVar527);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y1P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_2b8 +
         (double)local_110._0_8_ * local_2f8 + auVar100._0_8_ * local_2e8 +
         auVar101._0_8_ * dStack_2d8 + auVar98._0_8_ * local_2c8 +
         (double)local_110._8_8_ * dStack_2f0 + auVar100._8_8_ * dStack_2e0 +
         auVar101._8_8_ * dStack_2d0 + auVar98._8_8_ * dStack_2c0 +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar77._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar77._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar77,local_448.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  dVar107 = -auVar98._0_8_;
  dVar109 = -auVar98._8_8_;
  auVar261._0_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar261._8_8_ =
       -local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar261);
  auVar262._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[1];
  auVar262._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[3] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar391._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar391._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar262,auVar391);
  auVar263._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[6] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[7];
  auVar263._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[9] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar392._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar392._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar263,auVar392);
  auVar393._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xc] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xd];
  auVar393._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0xf] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar479._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar479._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar393,auVar479);
  auVar480._0_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x12] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x13];
  auVar480._8_8_ =
       dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x15] +
       dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                 m_data.array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar528._0_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar528._8_8_ =
       local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar480,auVar528);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = ((dVar107 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                     m_data.array[0x18] +
          dVar109 * (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.
                    m_data.array[0x19]) -
         local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  auVar58._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar58._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  auVar98 = vmovhpd_avx(auVar58,local_538.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data.array[3]);
  local_358._0_8_ = -auVar98._0_8_;
  local_358._8_8_ = -auVar98._8_8_;
  auVar264._0_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  auVar264._8_8_ =
       -local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6];
  vmovlpd_avx(auVar264);
  local_330 = y2P;
  local_328 = (Matrix<double,_3,_9,_0,_3,_9> *)0x3;
  auVar265._0_8_ =
       (double)local_358._0_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[0]
       + (double)local_358._8_8_ *
         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [1];
  auVar265._8_8_ =
       (double)local_358._0_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[3]
       + (double)local_358._8_8_ *
         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [4];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 2),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[5]);
  auVar394._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar394._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar99 = vsubpd_avx(auVar265,auVar394);
  auVar266._0_8_ =
       (double)local_358._0_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[6]
       + (double)local_358._8_8_ *
         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [7];
  auVar266._8_8_ =
       (double)local_358._0_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array[9]
       + (double)local_358._8_8_ *
         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 8),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0xb]);
  auVar395._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar395._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar100 = vsubpd_avx(auVar266,auVar395);
  auVar396._0_8_ =
       (double)local_358._0_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xc] + (double)local_358._8_8_ *
               (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
               array[0xd];
  auVar396._8_8_ =
       (double)local_358._0_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0xf] + (double)local_358._8_8_ *
               (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
               array[0x10];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0xe),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x11]);
  auVar481._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar481._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar101 = vsubpd_avx(auVar396,auVar481);
  auVar482._0_8_ =
       (double)local_358._0_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x12] + (double)local_358._8_8_ *
                (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data
                .array[0x13];
  auVar482._8_8_ =
       (double)local_358._0_8_ *
       (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
       [0x15] + (double)local_358._8_8_ *
                (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data
                .array[0x16];
  auVar98 = vmovhpd_avx(*(undefined1 (*) [16])
                         ((y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                          m_storage.m_data.array + 0x14),
                        (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).
                        m_storage.m_data.array[0x17]);
  auVar529._0_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._0_8_;
  auVar529._8_8_ =
       local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [6] * auVar98._8_8_;
  auVar98 = vsubpd_avx(auVar482,auVar529);
  local_110._0_8_ = auVar99._0_8_;
  local_110._8_8_ = auVar99._8_8_;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xe]
       = (((double)local_358._0_8_ *
           (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.
           array[0x18] +
          (double)local_358._8_8_ *
          (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
          [0x19]) -
         local_538.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         (y2P->super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>).m_storage.m_data.array
         [0x1a]) * local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.
                   m_data.array[8] +
         (double)local_110._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[0] +
         auVar100._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[2] +
         auVar101._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[4] +
         auVar98._0_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[6] +
         (double)local_110._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[1] +
         auVar100._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[3] +
         auVar101._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[5] +
         auVar98._8_8_ *
         local_208.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
         array[7] +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  local_578 = 1.0;
  local_580.data = (double *)m11P;
  local_348.m_other = -1.0;
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_570.data = (double *)local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_118 = (DstXprType *)local_110;
  local_340._0_8_ = &local_498;
  local_340._8_8_ = (SrcEvaluatorType *)local_358;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  pMVar97 = local_540;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xf] = (double)*(SrcEvaluatorType **)local_560.m_dst;
  _local_110 = ZEXT864(0) << 0x20;
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m22P;
  local_348.m_other = -1.0;
  local_570.data = (double *)local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_118 = (DstXprType *)local_110;
  local_c8 = &local_498;
  local_340._0_8_ = &local_4e8;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xf] = (double)*(SrcEvaluatorType **)local_560.m_dst +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xf];
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m12P;
  local_348.m_other = -2.0;
  local_570.data = (double *)local_110;
  local_118 = (DstXprType *)local_110;
  local_c8 = &local_4e8;
  local_340._0_8_ = &local_4e8;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = &local_498;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xf] = (double)*(SrcEvaluatorType **)local_560.m_dst +
          (pMVar97->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0xf];
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m11P;
  local_348.m_other = -2.0;
  local_570.data = (double *)local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_118 = (DstXprType *)local_110;
  local_340._0_8_ = local_c8;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_258;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_218 +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_258 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_248 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_238 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_228 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_250 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_240 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_230 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_220);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst;
  _local_110 = ZEXT864(0) << 0x20;
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m22P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_168;
  local_570.data = (double *)local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = &local_4e8;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m12P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_168;
  local_570.data = (double *)local_110;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = &local_498;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m12P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_4e8;
  local_570.data = (double *)local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_258;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_218 +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_258 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_248 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_238 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_228 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_250 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_240 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_230 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_220);
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m11P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_498;
  local_570.data = (double *)local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2a8;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_268 +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_2a8 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_298 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_288 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_278 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_2a0 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_290 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_280 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_270);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  _local_110 = ZEXT864(0) << 0x20;
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m22P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_1b8;
  local_570.data = (double *)local_110;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = &local_4e8;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m12P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_1b8;
  local_570.data = (double *)local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = &local_498;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m12P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_4e8;
  local_570.data = (double *)local_110;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2a8;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_268 +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_2a8 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_298 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_288 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_278 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_2a0 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_290 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_280 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_270);
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m11P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_498;
  local_570.data = (double *)local_110;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Transpose<Eigen::Matrix<double,9,1,0,9,1>>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = (Matrix<double,_9,_1,_0,_9,_1> *)&local_2f8;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) * local_2b8 +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] * local_2f8 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x10) * local_2e8 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) * dStack_2d8 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x30) * local_2c8 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) * dStack_2f0 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x18) * dStack_2e0 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) * dStack_2d0 +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x38) * dStack_2c0);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst;
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  _local_110 = ZEXT864(0) << 0x20;
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m22P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_208;
  local_570.data = (double *)local_110;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = &local_4e8;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_4e8.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m12P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_208;
  local_570.data = (double *)local_110;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  local_c8 = &local_498;
  local_560.m_src =
       (SrcEvaluatorType *)
       (*(double *)
         ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
                m_data.array + 0x40) *
        local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.
        array[8] +
       (local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.m_data.
       array[0] *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [0] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x10) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[2] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x20) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [4] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x30) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[6] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 8) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [1] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x18) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[3] +
       *(double *)
        ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).m_storage.
               m_data.array + 0x28) *
       local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data.array
       [5] + *(double *)
              ((long)(local_118->super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>).
                     m_storage.m_data.array + 0x38) *
             local_498.super_PlainObjectBase<Eigen::Matrix<double,_9,_1,_0,_9,_1>_>.m_storage.m_data
             .array[7]);
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  local_560.m_dst = (DstEvaluatorType *)&local_560.m_src;
  local_110 = ZEXT816(0);
  _local_110 = ZEXT1664(local_110);
  local_d0 = 0.0;
  local_578 = 1.0;
  local_580.data = (double *)m12P;
  local_348.m_other = -2.0;
  local_340._0_8_ = &local_4e8;
  local_570.data = (double *)local_110;
  local_118 = (DstXprType *)local_110;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Transpose<Eigen::Matrix<double,9,9,0,9,9>const>,Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,9,1,1,9>const>const,Eigen::Matrix<double,1,9,1,1,9>const>const>,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>
            ((Transpose<const_Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)&local_580,
             (Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_const_Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
              *)local_358,(Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)&local_570,&local_578)
  ;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xf]
       = (double)*(SrcEvaluatorType **)local_560.m_dst +
         (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xf];
  dVar107 = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
            m_data.array[0xd];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [3] = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
        array[0xc];
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [7] = dVar107;
  (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
  [0xb] = (local_540->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
          .array[0xe];
  dVar107 = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar107;
  (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac1->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  dVar107 = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar107;
  (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac2->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  dVar107 = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
            array[0xd];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[3] =
       (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
       [0xc];
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[7] =
       dVar107;
  (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0xb]
       = (G_jac3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
         array[0xe];
  return local_540;
}

Assistant:

Eigen::Matrix4d
opengv::relative_pose::modules::ge::composeGwithJacobians(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    Eigen::Matrix4d & G_jac1,
    Eigen::Matrix4d & G_jac2,
    Eigen::Matrix4d & G_jac3 )
{
  rotation_t R = math::cayley2rot_reduced(cayley);
  rotation_t R_jac1;
  rotation_t R_jac2;
  rotation_t R_jac3;

  R_jac1(0,0) =  2.0*cayley[0];
  R_jac1(0,1) =  2.0*cayley[1];
  R_jac1(0,2) =  2.0*cayley[2];
  R_jac1(1,0) =  2.0*cayley[1];
  R_jac1(1,1) = -2.0*cayley[0];
  R_jac1(1,2) = -2.0;
  R_jac1(2,0) =  2.0*cayley[2];
  R_jac1(2,1) =  2.0;
  R_jac1(2,2) = -2.0*cayley[0];
  R_jac2(0,0) = -2.0*cayley[1];
  R_jac2(0,1) =  2.0*cayley[0];
  R_jac2(0,2) =  2.0;
  R_jac2(1,0) =  2.0*cayley[0];
  R_jac2(1,1) =  2.0*cayley[1];
  R_jac2(1,2) =  2.0*cayley[2];
  R_jac2(2,0) = -2.0;
  R_jac2(2,1) =  2.0*cayley[2];
  R_jac2(2,2) = -2.0*cayley[1];
  R_jac3(0,0) = -2.0*cayley[2];
  R_jac3(0,1) = -2.0;
  R_jac3(0,2) =  2.0*cayley[0];
  R_jac3(1,0) =  2.0;
  R_jac3(1,1) = -2.0*cayley[2];
  R_jac3(1,2) =  2.0*cayley[1];
  R_jac3(2,0) =  2.0*cayley[0];
  R_jac3(2,1) =  2.0*cayley[1];
  R_jac3(2,2) =  2.0*cayley[2];

  //Fill the matrix G using the precomputed summation terms. Plus Jacobian.
  Eigen::Matrix4d G;
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  G(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  G(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  G(0,0) += temp;
  temp = 2.0*R_jac1.row(2)*yyF*R.row(2).transpose();
  G_jac1(0,0)  = temp;
  temp = -2.0*R_jac1.row(2)*yzF*R.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac1.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = 2.0*R_jac1.row(1)*zzF*R.row(1).transpose();
  G_jac1(0,0) += temp;
  temp = 2.0*R_jac2.row(2)*yyF*R.row(2).transpose();
  G_jac2(0,0)  = temp;
  temp = -2.0*R_jac2.row(2)*yzF*R.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac2.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = 2.0*R_jac2.row(1)*zzF*R.row(1).transpose();
  G_jac2(0,0) += temp;
  temp = 2.0*R_jac3.row(2)*yyF*R.row(2).transpose();
  G_jac3(0,0)  = temp;
  temp = -2.0*R_jac3.row(2)*yzF*R.row(1).transpose();
  G_jac3(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac3.row(1).transpose();
  G_jac3(0,0) += temp;
  temp = 2.0*R_jac3.row(1)*zzF*R.row(1).transpose();
  G_jac3(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  G(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  G(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  G(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  G(0,1) += temp;
  temp = R_jac1.row(2)*yzF*R.row(0).transpose();
  G_jac1(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac1.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = -2.0*R_jac1.row(2)*xyF*R.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = -R_jac1.row(1)*zzF*R.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac1.row(0).transpose();
  G_jac1(0,1) += temp;
  temp = R_jac1.row(1)*zxF*R.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = R.row(1)*zxF*R_jac1.row(2).transpose();
  G_jac1(0,1) += temp;
  temp = R_jac2.row(2)*yzF*R.row(0).transpose();
  G_jac2(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac2.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = -2.0*R_jac2.row(2)*xyF*R.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = -R_jac2.row(1)*zzF*R.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac2.row(0).transpose();
  G_jac2(0,1) += temp;
  temp = R_jac2.row(1)*zxF*R.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = R.row(1)*zxF*R_jac2.row(2).transpose();
  G_jac2(0,1) += temp;
  temp = R_jac3.row(2)*yzF*R.row(0).transpose();
  G_jac3(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac3.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = -2.0*R_jac3.row(2)*xyF*R.row(2).transpose();
  G_jac3(0,1) += temp;
  temp = -R_jac3.row(1)*zzF*R.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac3.row(0).transpose();
  G_jac3(0,1) += temp;
  temp = R_jac3.row(1)*zxF*R.row(2).transpose();
  G_jac3(0,1) += temp;
  temp = R.row(1)*zxF*R_jac3.row(2).transpose();
  G_jac3(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  G(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  G(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  G(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  G(0,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(1).transpose();
  G_jac1(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac1.row(1).transpose();
  G_jac1(0,2) += temp;
  temp = -R_jac1.row(2)*yyF*R.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac1.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = -2.0*R_jac1.row(1)*zxF*R.row(1).transpose();
  G_jac1(0,2) += temp;
  temp = R_jac1.row(1)*yzF*R.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = R.row(1)*yzF*R_jac1.row(0).transpose();
  G_jac1(0,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(1).transpose();
  G_jac2(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac2.row(1).transpose();
  G_jac2(0,2) += temp;
  temp = -R_jac2.row(2)*yyF*R.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac2.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = -2.0*R_jac2.row(1)*zxF*R.row(1).transpose();
  G_jac2(0,2) += temp;
  temp = R_jac2.row(1)*yzF*R.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = R.row(1)*yzF*R_jac2.row(0).transpose();
  G_jac2(0,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(1).transpose();
  G_jac3(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac3.row(1).transpose();
  G_jac3(0,2) += temp;
  temp = -R_jac3.row(2)*yyF*R.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac3.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = -2.0*R_jac3.row(1)*zxF*R.row(1).transpose();
  G_jac3(0,2) += temp;
  temp = R_jac3.row(1)*yzF*R.row(0).transpose();
  G_jac3(0,2) += temp;
  temp = R.row(1)*yzF*R_jac3.row(0).transpose();
  G_jac3(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  G(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  G(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  G(1,1) += temp;
  temp = 2.0*R_jac1.row(0)*zzF*R.row(0).transpose();
  G_jac1(1,1)  = temp;
  temp = -2.0*R_jac1.row(0)*zxF*R.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac1.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = 2.0*R_jac1.row(2)*xxF*R.row(2).transpose();
  G_jac1(1,1) += temp;
  temp = 2.0*R_jac2.row(0)*zzF*R.row(0).transpose();
  G_jac2(1,1)  = temp;
  temp = -2.0*R_jac2.row(0)*zxF*R.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac2.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = 2.0*R_jac2.row(2)*xxF*R.row(2).transpose();
  G_jac2(1,1) += temp;
  temp = 2.0*R_jac3.row(0)*zzF*R.row(0).transpose();
  G_jac3(1,1)  = temp;
  temp = -2.0*R_jac3.row(0)*zxF*R.row(2).transpose();
  G_jac3(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac3.row(2).transpose();
  G_jac3(1,1) += temp;
  temp = 2.0*R_jac3.row(2)*xxF*R.row(2).transpose();
  G_jac3(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  G(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  G(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  G(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  G(1,2) += temp;
  temp = R_jac1.row(0)*zxF*R.row(1).transpose();
  G_jac1(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac1.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = -2.0*R_jac1.row(0)*yzF*R.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = -R_jac1.row(2)*xxF*R.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac1.row(1).transpose();
  G_jac1(1,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = R.row(2)*xyF*R_jac1.row(0).transpose();
  G_jac1(1,2) += temp;
  temp = R_jac2.row(0)*zxF*R.row(1).transpose();
  G_jac2(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac2.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = -2.0*R_jac2.row(0)*yzF*R.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = -R_jac2.row(2)*xxF*R.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac2.row(1).transpose();
  G_jac2(1,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = R.row(2)*xyF*R_jac2.row(0).transpose();
  G_jac2(1,2) += temp;
  temp = R_jac3.row(0)*zxF*R.row(1).transpose();
  G_jac3(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac3.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = -2.0*R_jac3.row(0)*yzF*R.row(0).transpose();
  G_jac3(1,2) += temp;
  temp = -R_jac3.row(2)*xxF*R.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac3.row(1).transpose();
  G_jac3(1,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(0).transpose();
  G_jac3(1,2) += temp;
  temp = R.row(2)*xyF*R_jac3.row(0).transpose();
  G_jac3(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  G(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  G(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  G(2,2) += temp;
  temp = 2.0*R_jac1.row(1)*xxF*R.row(1).transpose();
  G_jac1(2,2)  = temp;
  temp = -2.0*R_jac1.row(0)*xyF*R.row(1).transpose();
  G_jac1(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac1.row(1).transpose();
  G_jac1(2,2) += temp;
  temp = 2.0*R_jac1.row(0)*yyF*R.row(0).transpose();
  G_jac1(2,2) += temp;
  temp = 2.0*R_jac2.row(1)*xxF*R.row(1).transpose();
  G_jac2(2,2)  = temp;
  temp = -2.0*R_jac2.row(0)*xyF*R.row(1).transpose();
  G_jac2(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac2.row(1).transpose();
  G_jac2(2,2) += temp;
  temp = 2.0*R_jac2.row(0)*yyF*R.row(0).transpose();
  G_jac2(2,2) += temp;
  temp = 2.0*R_jac3.row(1)*xxF*R.row(1).transpose();
  G_jac3(2,2)  = temp;
  temp = -2.0*R_jac3.row(0)*xyF*R.row(1).transpose();
  G_jac3(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac3.row(1).transpose();
  G_jac3(2,2) += temp;
  temp = 2.0*R_jac3.row(0)*yyF*R.row(0).transpose();
  G_jac3(2,2) += temp;

  G(1,0) = G(0,1);
  G(2,0) = G(0,2);
  G(2,1) = G(1,2);
  G_jac1(1,0) = G_jac1(0,1);
  G_jac1(2,0) = G_jac1(0,2);
  G_jac1(2,1) = G_jac1(1,2);
  G_jac2(1,0) = G_jac2(0,1);
  G_jac2(2,0) = G_jac2(0,2);
  G_jac2(2,1) = G_jac2(1,2);
  G_jac3(1,0) = G_jac3(0,1);
  G_jac3(2,0) = G_jac3(0,2);
  G_jac3(2,1) = G_jac3(1,2);

  //the generalized terms:
  Eigen::Matrix<double,1,9> Rows;
  Rows.block<1,3>(0,0) = R.row(0);
  Rows.block<1,3>(0,3) = R.row(1);
  Rows.block<1,3>(0,6) = R.row(2);
  
  Eigen::Matrix<double,9,1> Cols;
  Cols.block<3,1>(0,0) = R.col(0);
  Cols.block<3,1>(3,0) = R.col(1);
  Cols.block<3,1>(6,0) = R.col(2);
  
  Eigen::Matrix<double,1,9> Rows_jac1;
  Rows_jac1.block<1,3>(0,0) = R_jac1.row(0);
  Rows_jac1.block<1,3>(0,3) = R_jac1.row(1);
  Rows_jac1.block<1,3>(0,6) = R_jac1.row(2);
  Eigen::Matrix<double,1,9> Rows_jac2;
  Rows_jac2.block<1,3>(0,0) = R_jac2.row(0);
  Rows_jac2.block<1,3>(0,3) = R_jac2.row(1);
  Rows_jac2.block<1,3>(0,6) = R_jac2.row(2);
  Eigen::Matrix<double,1,9> Rows_jac3;
  Rows_jac3.block<1,3>(0,0) = R_jac3.row(0);
  Rows_jac3.block<1,3>(0,3) = R_jac3.row(1);
  Rows_jac3.block<1,3>(0,6) = R_jac3.row(2);
  
  Eigen::Matrix<double,9,1> Cols_jac1;
  Cols_jac1.block<3,1>(0,0) = R_jac1.col(0);
  Cols_jac1.block<3,1>(3,0) = R_jac1.col(1);
  Cols_jac1.block<3,1>(6,0) = R_jac1.col(2);
  Eigen::Matrix<double,9,1> Cols_jac2;
  Cols_jac2.block<3,1>(0,0) = R_jac2.col(0);
  Cols_jac2.block<3,1>(3,0) = R_jac2.col(1);
  Cols_jac2.block<3,1>(6,0) = R_jac2.col(2);
  Eigen::Matrix<double,9,1> Cols_jac3;
  Cols_jac3.block<3,1>(0,0) = R_jac3.col(0);
  Cols_jac3.block<3,1>(3,0) = R_jac3.col(1);
  Cols_jac3.block<3,1>(6,0) = R_jac3.col(2);
  
  temp =      R.row(2)*y1P*Cols;
  G(0,3)  = temp;
  temp =      R.row(2)*y2P*Rows.transpose();
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols;
  G(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows.transpose();
  G(0,3) += temp;
  temp =      R_jac1.row(2)*y1P*Cols;
  G_jac1(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac1;
  G_jac1(0,3) += temp;
  temp =      R_jac1.row(2)*y2P*Rows.transpose();
  G_jac1(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac1.transpose();
  G_jac1(0,3) += temp;
  temp = -1.0*R_jac1.row(1)*z1P*Cols;
  G_jac1(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac1;
  G_jac1(0,3) += temp;
  temp = -1.0*R_jac1.row(1)*z2P*Rows.transpose();
  G_jac1(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac1.transpose();
  G_jac1(0,3) += temp;
  temp =      R_jac2.row(2)*y1P*Cols;
  G_jac2(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac2;
  G_jac2(0,3) += temp;
  temp =      R_jac2.row(2)*y2P*Rows.transpose();
  G_jac2(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac2.transpose();
  G_jac2(0,3) += temp;
  temp = -1.0*R_jac2.row(1)*z1P*Cols;
  G_jac2(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac2;
  G_jac2(0,3) += temp;
  temp = -1.0*R_jac2.row(1)*z2P*Rows.transpose();
  G_jac2(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac2.transpose();
  G_jac2(0,3) += temp;
  temp =      R_jac3.row(2)*y1P*Cols;
  G_jac3(0,3)  = temp;
  temp =      R.row(2)*y1P*Cols_jac3;
  G_jac3(0,3) += temp;
  temp =      R_jac3.row(2)*y2P*Rows.transpose();
  G_jac3(0,3) += temp;
  temp =      R.row(2)*y2P*Rows_jac3.transpose();
  G_jac3(0,3) += temp;
  temp = -1.0*R_jac3.row(1)*z1P*Cols;
  G_jac3(0,3) += temp;
  temp = -1.0*R.row(1)*z1P*Cols_jac3;
  G_jac3(0,3) += temp;
  temp = -1.0*R_jac3.row(1)*z2P*Rows.transpose();
  G_jac3(0,3) += temp;
  temp = -1.0*R.row(1)*z2P*Rows_jac3.transpose();
  G_jac3(0,3) += temp;
  
  temp =      R.row(0)*z1P*Cols;
  G(1,3)  = temp;
  temp =      R.row(0)*z2P*Rows.transpose();
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols;
  G(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows.transpose();
  G(1,3) += temp;
  temp =      R_jac1.row(0)*z1P*Cols;
  G_jac1(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac1;
  G_jac1(1,3) += temp;
  temp =      R_jac1.row(0)*z2P*Rows.transpose();
  G_jac1(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac1.transpose();
  G_jac1(1,3) += temp;
  temp = -1.0*R_jac1.row(2)*x1P*Cols;
  G_jac1(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac1;
  G_jac1(1,3) += temp;
  temp = -1.0*R_jac1.row(2)*x2P*Rows.transpose();
  G_jac1(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac1.transpose();
  G_jac1(1,3) += temp;
  temp =      R_jac2.row(0)*z1P*Cols;
  G_jac2(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac2;
  G_jac2(1,3) += temp;
  temp =      R_jac2.row(0)*z2P*Rows.transpose();
  G_jac2(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac2.transpose();
  G_jac2(1,3) += temp;
  temp = -1.0*R_jac2.row(2)*x1P*Cols;
  G_jac2(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac2;
  G_jac2(1,3) += temp;
  temp = -1.0*R_jac2.row(2)*x2P*Rows.transpose();
  G_jac2(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac2.transpose();
  G_jac2(1,3) += temp;
  temp =      R_jac3.row(0)*z1P*Cols;
  G_jac3(1,3)  = temp;
  temp =      R.row(0)*z1P*Cols_jac3;
  G_jac3(1,3) += temp;
  temp =      R_jac3.row(0)*z2P*Rows.transpose();
  G_jac3(1,3) += temp;
  temp =      R.row(0)*z2P*Rows_jac3.transpose();
  G_jac3(1,3) += temp;
  temp = -1.0*R_jac3.row(2)*x1P*Cols;
  G_jac3(1,3) += temp;
  temp = -1.0*R.row(2)*x1P*Cols_jac3;
  G_jac3(1,3) += temp;
  temp = -1.0*R_jac3.row(2)*x2P*Rows.transpose();
  G_jac3(1,3) += temp;
  temp = -1.0*R.row(2)*x2P*Rows_jac3.transpose();
  G_jac3(1,3) += temp;
  
  temp =      R.row(1)*x1P*Cols;
  G(2,3)  = temp;
  temp =      R.row(1)*x2P*Rows.transpose();
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols;
  G(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows.transpose();
  G(2,3) += temp;
  temp =      R_jac1.row(1)*x1P*Cols;
  G_jac1(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac1;
  G_jac1(2,3) += temp;
  temp =      R_jac1.row(1)*x2P*Rows.transpose();
  G_jac1(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac1.transpose();
  G_jac1(2,3) += temp;
  temp = -1.0*R_jac1.row(0)*y1P*Cols;
  G_jac1(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac1;
  G_jac1(2,3) += temp;
  temp = -1.0*R_jac1.row(0)*y2P*Rows.transpose();
  G_jac1(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac1.transpose();
  G_jac1(2,3) += temp;
  temp =      R_jac2.row(1)*x1P*Cols;
  G_jac2(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac2;
  G_jac2(2,3) += temp;
  temp =      R_jac2.row(1)*x2P*Rows.transpose();
  G_jac2(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac2.transpose();
  G_jac2(2,3) += temp;
  temp = -1.0*R_jac2.row(0)*y1P*Cols;
  G_jac2(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac2;
  G_jac2(2,3) += temp;
  temp = -1.0*R_jac2.row(0)*y2P*Rows.transpose();
  G_jac2(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac2.transpose();
  G_jac2(2,3) += temp;
  temp =      R_jac3.row(1)*x1P*Cols;
  G_jac3(2,3)  = temp;
  temp =      R.row(1)*x1P*Cols_jac3;
  G_jac3(2,3) += temp;
  temp =      R_jac3.row(1)*x2P*Rows.transpose();
  G_jac3(2,3) += temp;
  temp =      R.row(1)*x2P*Rows_jac3.transpose();
  G_jac3(2,3) += temp;
  temp = -1.0*R_jac3.row(0)*y1P*Cols;
  G_jac3(2,3) += temp;
  temp = -1.0*R.row(0)*y1P*Cols_jac3;
  G_jac3(2,3) += temp;
  temp = -1.0*R_jac3.row(0)*y2P*Rows.transpose();
  G_jac3(2,3) += temp;
  temp = -1.0*R.row(0)*y2P*Rows_jac3.transpose();
  G_jac3(2,3) += temp;
  
  temp = -1.0*Cols.transpose()*m11P*Cols;
  G(3,3)  = temp;
  temp = -1.0*Rows*m22P*Rows.transpose();
  G(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols;
  G(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac1;
  G_jac1(3,3)  = temp;
  temp = -2.0*Rows_jac1*m22P*Rows.transpose();
  G_jac1(3,3) += temp;
  temp = -2.0*Rows_jac1*m12P*Cols;
  G_jac1(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac1;
  G_jac1(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac2;
  G_jac2(3,3)  = temp;
  temp = -2.0*Rows_jac2*m22P*Rows.transpose();
  G_jac2(3,3) += temp;
  temp = -2.0*Rows_jac2*m12P*Cols;
  G_jac2(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac2;
  G_jac2(3,3) += temp;
  temp = -2.0*Cols.transpose()*m11P*Cols_jac3;
  G_jac3(3,3)  = temp;
  temp = -2.0*Rows_jac3*m22P*Rows.transpose();
  G_jac3(3,3) += temp;
  temp = -2.0*Rows_jac3*m12P*Cols;
  G_jac3(3,3) += temp;
  temp = -2.0*Rows*m12P*Cols_jac3;
  G_jac3(3,3) += temp;
  
  G(3,0) = G(0,3);
  G(3,1) = G(1,3);
  G(3,2) = G(2,3);
  G_jac1(3,0) = G_jac1(0,3);
  G_jac1(3,1) = G_jac1(1,3);
  G_jac1(3,2) = G_jac1(2,3);
  G_jac2(3,0) = G_jac2(0,3);
  G_jac2(3,1) = G_jac2(1,3);
  G_jac2(3,2) = G_jac2(2,3);
  G_jac3(3,0) = G_jac3(0,3);
  G_jac3(3,1) = G_jac3(1,3);
  G_jac3(3,2) = G_jac3(2,3);

  return G;
}